

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx512::CurveNiIntersectorK<4,4>::
     intersect_hn<embree::avx512::OrientedCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx512::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  BBox1f BVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  uint uVar4;
  uint uVar5;
  Geometry *pGVar6;
  long lVar7;
  __int_type_conflict _Var8;
  RTCFilterFunctionN p_Var9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined8 uVar12;
  undefined8 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  bool bVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  byte bVar22;
  uint uVar23;
  ulong uVar24;
  long lVar25;
  uint uVar26;
  ulong uVar27;
  undefined8 unaff_RBP;
  ulong uVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  ulong uVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar108 [32];
  undefined1 auVar110 [32];
  undefined1 auVar112 [32];
  undefined1 auVar114 [32];
  float fVar116;
  float fVar121;
  vint4 bi_2;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float fVar122;
  undefined4 uVar123;
  float fVar126;
  float fVar127;
  vint4 bi_1;
  float fVar128;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [32];
  vint4 ai_2;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  vint4 bi;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  vint4 ai;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  vint4 ai_1;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  vfloat4 a0_3;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  __m128 a_1;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  __m128 a;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [32];
  float fVar186;
  float fVar195;
  float fVar196;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  float fVar197;
  float fVar198;
  float fVar208;
  float fVar209;
  vfloat4 a0_1;
  undefined1 auVar199 [16];
  float fVar210;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar211;
  float fVar219;
  float fVar220;
  vfloat4 a0;
  undefined1 auVar212 [16];
  float fVar221;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [64];
  undefined1 auVar231 [64];
  undefined1 auVar232 [64];
  undefined1 auVar233 [64];
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 in_ZMM29 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  undefined1 local_378 [16];
  RayQueryContext *local_360;
  ulong local_358;
  long local_350;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  RTCHitN local_108 [16];
  undefined1 local_f8 [16];
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [16];
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  BBox1f cv_stack [4];
  undefined1 auVar107 [32];
  undefined1 auVar109 [32];
  undefined1 auVar111 [32];
  undefined1 auVar113 [32];
  undefined1 auVar115 [32];
  float fVar144;
  float fVar147;
  float fVar148;
  
  uVar24 = (ulong)(byte)prim[1];
  fVar116 = *(float *)(prim + uVar24 * 0x19 + 0x12);
  auVar37 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar37 = vinsertps_avx(auVar37,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar38 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar38 = vinsertps_avx(auVar38,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar37 = vsubps_avx(auVar37,*(undefined1 (*) [16])(prim + uVar24 * 0x19 + 6));
  auVar134._0_4_ = fVar116 * auVar37._0_4_;
  auVar134._4_4_ = fVar116 * auVar37._4_4_;
  auVar134._8_4_ = fVar116 * auVar37._8_4_;
  auVar134._12_4_ = fVar116 * auVar37._12_4_;
  auVar43._0_4_ = fVar116 * auVar38._0_4_;
  auVar43._4_4_ = fVar116 * auVar38._4_4_;
  auVar43._8_4_ = fVar116 * auVar38._8_4_;
  auVar43._12_4_ = fVar116 * auVar38._12_4_;
  auVar37 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 * 4 + 6)));
  auVar37 = vcvtdq2ps_avx(auVar37);
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 * 5 + 6)));
  auVar34 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 * 6 + 6)));
  auVar38 = vcvtdq2ps_avx(auVar38);
  auVar34 = vcvtdq2ps_avx(auVar34);
  auVar39 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 * 0xb + 6)));
  auVar39 = vcvtdq2ps_avx(auVar39);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 * 0xc + 6)));
  auVar35 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 * 0xd + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar35 = vcvtdq2ps_avx(auVar35);
  auVar58 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 * 0x12 + 6)));
  auVar58 = vcvtdq2ps_avx(auVar58);
  auVar45 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 * 0x13 + 6)));
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 * 0x14 + 6)));
  auVar45 = vcvtdq2ps_avx(auVar45);
  auVar36 = vcvtdq2ps_avx(auVar36);
  auVar53._4_4_ = auVar43._0_4_;
  auVar53._0_4_ = auVar43._0_4_;
  auVar53._8_4_ = auVar43._0_4_;
  auVar53._12_4_ = auVar43._0_4_;
  auVar11 = vshufps_avx(auVar43,auVar43,0x55);
  auVar41 = vshufps_avx(auVar43,auVar43,0xaa);
  fVar116 = auVar41._0_4_;
  auVar48._0_4_ = fVar116 * auVar34._0_4_;
  fVar121 = auVar41._4_4_;
  auVar48._4_4_ = fVar121 * auVar34._4_4_;
  fVar197 = auVar41._8_4_;
  auVar48._8_4_ = fVar197 * auVar34._8_4_;
  fVar186 = auVar41._12_4_;
  auVar48._12_4_ = fVar186 * auVar34._12_4_;
  auVar47._0_4_ = auVar35._0_4_ * fVar116;
  auVar47._4_4_ = auVar35._4_4_ * fVar121;
  auVar47._8_4_ = auVar35._8_4_ * fVar197;
  auVar47._12_4_ = auVar35._12_4_ * fVar186;
  auVar44._0_4_ = auVar36._0_4_ * fVar116;
  auVar44._4_4_ = auVar36._4_4_ * fVar121;
  auVar44._8_4_ = auVar36._8_4_ * fVar197;
  auVar44._12_4_ = auVar36._12_4_ * fVar186;
  auVar41 = vfmadd231ps_fma(auVar48,auVar11,auVar38);
  auVar40 = vfmadd231ps_fma(auVar47,auVar11,auVar10);
  auVar11 = vfmadd231ps_fma(auVar44,auVar45,auVar11);
  auVar42 = vfmadd231ps_fma(auVar41,auVar53,auVar37);
  auVar40 = vfmadd231ps_fma(auVar40,auVar53,auVar39);
  auVar43 = vfmadd231ps_fma(auVar11,auVar58,auVar53);
  auVar54._4_4_ = auVar134._0_4_;
  auVar54._0_4_ = auVar134._0_4_;
  auVar54._8_4_ = auVar134._0_4_;
  auVar54._12_4_ = auVar134._0_4_;
  auVar11 = vshufps_avx(auVar134,auVar134,0x55);
  auVar41 = vshufps_avx(auVar134,auVar134,0xaa);
  auVar34 = vmulps_avx512vl(auVar41,auVar34);
  auVar135._0_4_ = auVar41._0_4_ * auVar35._0_4_;
  auVar135._4_4_ = auVar41._4_4_ * auVar35._4_4_;
  auVar135._8_4_ = auVar41._8_4_ * auVar35._8_4_;
  auVar135._12_4_ = auVar41._12_4_ * auVar35._12_4_;
  auVar129._0_4_ = auVar41._0_4_ * auVar36._0_4_;
  auVar129._4_4_ = auVar41._4_4_ * auVar36._4_4_;
  auVar129._8_4_ = auVar41._8_4_ * auVar36._8_4_;
  auVar129._12_4_ = auVar41._12_4_ * auVar36._12_4_;
  auVar35 = vfmadd231ps_avx512vl(auVar34,auVar11,auVar38);
  auVar38 = vfmadd231ps_fma(auVar135,auVar11,auVar10);
  auVar34 = vfmadd231ps_fma(auVar129,auVar11,auVar45);
  auVar36 = vfmadd231ps_avx512vl(auVar35,auVar54,auVar37);
  auVar10 = vfmadd231ps_fma(auVar38,auVar54,auVar39);
  auVar45 = vfmadd231ps_fma(auVar34,auVar54,auVar58);
  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar235 = ZEXT1664(auVar37);
  auVar50._8_4_ = 0x219392ef;
  auVar50._0_8_ = 0x219392ef219392ef;
  auVar50._12_4_ = 0x219392ef;
  auVar38 = vandps_avx512vl(auVar42,auVar37);
  uVar28 = vcmpps_avx512vl(auVar38,auVar50,1);
  bVar31 = (bool)((byte)uVar28 & 1);
  auVar41._0_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar42._0_4_;
  bVar31 = (bool)((byte)(uVar28 >> 1) & 1);
  auVar41._4_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar42._4_4_;
  bVar31 = (bool)((byte)(uVar28 >> 2) & 1);
  auVar41._8_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar42._8_4_;
  bVar31 = (bool)((byte)(uVar28 >> 3) & 1);
  auVar41._12_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar42._12_4_;
  auVar38 = vandps_avx512vl(auVar40,auVar37);
  uVar28 = vcmpps_avx512vl(auVar38,auVar50,1);
  bVar31 = (bool)((byte)uVar28 & 1);
  auVar42._0_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar40._0_4_;
  bVar31 = (bool)((byte)(uVar28 >> 1) & 1);
  auVar42._4_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar40._4_4_;
  bVar31 = (bool)((byte)(uVar28 >> 2) & 1);
  auVar42._8_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar40._8_4_;
  bVar31 = (bool)((byte)(uVar28 >> 3) & 1);
  auVar42._12_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar40._12_4_;
  auVar37 = vandps_avx512vl(auVar43,auVar37);
  uVar28 = vcmpps_avx512vl(auVar37,auVar50,1);
  bVar31 = (bool)((byte)uVar28 & 1);
  auVar40._0_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar43._0_4_;
  bVar31 = (bool)((byte)(uVar28 >> 1) & 1);
  auVar40._4_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar43._4_4_;
  bVar31 = (bool)((byte)(uVar28 >> 2) & 1);
  auVar40._8_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar43._8_4_;
  bVar31 = (bool)((byte)(uVar28 >> 3) & 1);
  auVar40._12_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar43._12_4_;
  auVar37 = vrcp14ps_avx512vl(auVar41);
  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar236 = ZEXT1664(auVar38);
  auVar34 = vfnmadd213ps_avx512vl(auVar41,auVar37,auVar38);
  auVar34 = vfmadd132ps_fma(auVar34,auVar37,auVar37);
  auVar37 = vrcp14ps_avx512vl(auVar42);
  auVar39 = vfnmadd213ps_avx512vl(auVar42,auVar37,auVar38);
  auVar35 = vfmadd132ps_fma(auVar39,auVar37,auVar37);
  auVar37 = vrcp14ps_avx512vl(auVar40);
  auVar38 = vfnmadd213ps_avx512vl(auVar40,auVar37,auVar38);
  auVar58 = vfmadd132ps_fma(auVar38,auVar37,auVar37);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(prim + uVar24 * 7 + 6);
  auVar37 = vpmovsxwd_avx(auVar37);
  auVar37 = vcvtdq2ps_avx(auVar37);
  auVar37 = vsubps_avx512vl(auVar37,auVar36);
  auVar51._0_4_ = auVar34._0_4_ * auVar37._0_4_;
  auVar51._4_4_ = auVar34._4_4_ * auVar37._4_4_;
  auVar51._8_4_ = auVar34._8_4_ * auVar37._8_4_;
  auVar51._12_4_ = auVar34._12_4_ * auVar37._12_4_;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + uVar24 * 9 + 6);
  auVar37 = vpmovsxwd_avx(auVar38);
  auVar37 = vcvtdq2ps_avx(auVar37);
  auVar37 = vsubps_avx512vl(auVar37,auVar36);
  auVar49._0_4_ = auVar34._0_4_ * auVar37._0_4_;
  auVar49._4_4_ = auVar34._4_4_ * auVar37._4_4_;
  auVar49._8_4_ = auVar34._8_4_ * auVar37._8_4_;
  auVar49._12_4_ = auVar34._12_4_ * auVar37._12_4_;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *(ulong *)(prim + uVar24 * 0xe + 6);
  auVar37 = vpmovsxwd_avx(auVar34);
  auVar37 = vcvtdq2ps_avx(auVar37);
  auVar37 = vsubps_avx(auVar37,auVar10);
  auVar52._0_4_ = auVar35._0_4_ * auVar37._0_4_;
  auVar52._4_4_ = auVar35._4_4_ * auVar37._4_4_;
  auVar52._8_4_ = auVar35._8_4_ * auVar37._8_4_;
  auVar52._12_4_ = auVar35._12_4_ * auVar37._12_4_;
  auVar34 = vpbroadcastd_avx512vl();
  auVar39._8_8_ = 0;
  auVar39._0_8_ = *(ulong *)(prim + (ulong)(byte)prim[1] * 0x10 + 6);
  auVar37 = vpmovsxwd_avx(auVar39);
  auVar37 = vcvtdq2ps_avx(auVar37);
  auVar38 = vsubps_avx(auVar37,auVar10);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar24 * 0x15 + 6);
  auVar37 = vpmovsxwd_avx(auVar10);
  auVar59._0_4_ = auVar35._0_4_ * auVar38._0_4_;
  auVar59._4_4_ = auVar35._4_4_ * auVar38._4_4_;
  auVar59._8_4_ = auVar35._8_4_ * auVar38._8_4_;
  auVar59._12_4_ = auVar35._12_4_ * auVar38._12_4_;
  auVar37 = vcvtdq2ps_avx(auVar37);
  auVar37 = vsubps_avx(auVar37,auVar45);
  auVar136._0_4_ = auVar58._0_4_ * auVar37._0_4_;
  auVar136._4_4_ = auVar58._4_4_ * auVar37._4_4_;
  auVar136._8_4_ = auVar58._8_4_ * auVar37._8_4_;
  auVar136._12_4_ = auVar58._12_4_ * auVar37._12_4_;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = *(ulong *)(prim + uVar24 * 0x17 + 6);
  auVar37 = vpmovsxwd_avx(auVar35);
  auVar37 = vcvtdq2ps_avx(auVar37);
  auVar37 = vsubps_avx(auVar37,auVar45);
  auVar46._0_4_ = auVar58._0_4_ * auVar37._0_4_;
  auVar46._4_4_ = auVar58._4_4_ * auVar37._4_4_;
  auVar46._8_4_ = auVar58._8_4_ * auVar37._8_4_;
  auVar46._12_4_ = auVar58._12_4_ * auVar37._12_4_;
  auVar37 = vpminsd_avx(auVar51,auVar49);
  auVar38 = vpminsd_avx(auVar52,auVar59);
  auVar37 = vmaxps_avx(auVar37,auVar38);
  auVar38 = vpminsd_avx(auVar136,auVar46);
  uVar123 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar58._4_4_ = uVar123;
  auVar58._0_4_ = uVar123;
  auVar58._8_4_ = uVar123;
  auVar58._12_4_ = uVar123;
  auVar38 = vmaxps_avx512vl(auVar38,auVar58);
  auVar37 = vmaxps_avx(auVar37,auVar38);
  auVar45._8_4_ = 0x3f7ffffa;
  auVar45._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar45._12_4_ = 0x3f7ffffa;
  auVar39 = vmulps_avx512vl(auVar37,auVar45);
  auVar37 = vpmaxsd_avx(auVar51,auVar49);
  auVar38 = vpmaxsd_avx(auVar52,auVar59);
  auVar37 = vminps_avx(auVar37,auVar38);
  auVar38 = vpmaxsd_avx(auVar136,auVar46);
  uVar123 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar36._4_4_ = uVar123;
  auVar36._0_4_ = uVar123;
  auVar36._8_4_ = uVar123;
  auVar36._12_4_ = uVar123;
  auVar38 = vminps_avx512vl(auVar38,auVar36);
  auVar37 = vminps_avx(auVar37,auVar38);
  auVar11._8_4_ = 0x3f800003;
  auVar11._0_8_ = 0x3f8000033f800003;
  auVar11._12_4_ = 0x3f800003;
  auVar37 = vmulps_avx512vl(auVar37,auVar11);
  uVar12 = vcmpps_avx512vl(auVar39,auVar37,2);
  uVar13 = vpcmpgtd_avx512vl(auVar34,_DAT_01f4ad30);
  uVar28 = CONCAT44((int)((ulong)unaff_RBP >> 0x20),(uint)((byte)uVar12 & 0xf & (byte)uVar13));
  auVar37 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar230 = ZEXT1664(auVar38);
  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar231 = ZEXT1664(auVar38);
  auVar238 = ZEXT464(0x3f800000);
  auVar38 = vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
  auVar237 = ZEXT1664(auVar38);
LAB_017db9c9:
  if (uVar28 == 0) {
    return;
  }
  lVar25 = 0;
  for (uVar24 = uVar28; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
    lVar25 = lVar25 + 1;
  }
  uVar4 = *(uint *)(prim + 2);
  local_358 = (ulong)*(uint *)(prim + lVar25 * 4 + 6);
  pGVar6 = (context->scene->geometries).items[uVar4].ptr;
  lVar7 = *(long *)&pGVar6[1].time_range.upper;
  uVar24 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                           local_358 *
                           pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar38 = *(undefined1 (*) [16])(lVar7 + (long)pGVar6[1].intersectionFilterN * uVar24);
  lVar25 = uVar24 + 1;
  auVar34 = *(undefined1 (*) [16])(lVar7 + (long)pGVar6[1].intersectionFilterN * lVar25);
  _Var8 = pGVar6[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar10 = *(undefined1 (*) [16])(_Var8 + (long)pGVar6[2].userPtr * uVar24);
  auVar35 = *(undefined1 (*) [16])(_Var8 + (long)pGVar6[2].userPtr * lVar25);
  auVar58 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar58 = vinsertps_avx(auVar58,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar116 = *(float *)(ray + k * 4 + 0x30);
  auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
  auVar41 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar6[2].intersectionFilterN + (long)pGVar6[2].pointQueryFunc * uVar24),
                       auVar38,auVar40);
  auVar42 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar6[2].intersectionFilterN + (long)pGVar6[2].pointQueryFunc * lVar25),
                       auVar34,auVar40);
  auVar43 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar6[3].userPtr + uVar24 * *(long *)&pGVar6[3].fnumTimeSegments),
                       auVar10,auVar40);
  auVar44 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar6[3].userPtr + *(long *)&pGVar6[3].fnumTimeSegments * lVar25),
                       auVar35,auVar40);
  auVar59 = ZEXT816(0) << 0x40;
  auVar55._0_4_ = auVar34._0_4_ * 0.0;
  auVar55._4_4_ = auVar34._4_4_ * 0.0;
  auVar55._8_4_ = auVar34._8_4_ * 0.0;
  auVar55._12_4_ = auVar34._12_4_ * 0.0;
  auVar36 = vfmadd231ps_fma(auVar55,auVar42,auVar59);
  auVar45 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar41,auVar36);
  auVar61._0_4_ = auVar38._0_4_ + auVar45._0_4_;
  auVar61._4_4_ = auVar38._4_4_ + auVar45._4_4_;
  auVar61._8_4_ = auVar38._8_4_ + auVar45._8_4_;
  auVar61._12_4_ = auVar38._12_4_ + auVar45._12_4_;
  auVar129 = auVar230._0_16_;
  auVar45 = vfmadd231ps_avx512vl(auVar36,auVar41,auVar129);
  auVar46 = vfnmadd231ps_avx512vl(auVar45,auVar38,auVar129);
  auVar199._0_4_ = auVar35._0_4_ * 0.0;
  auVar199._4_4_ = auVar35._4_4_ * 0.0;
  auVar199._8_4_ = auVar35._8_4_ * 0.0;
  auVar199._12_4_ = auVar35._12_4_ * 0.0;
  auVar36 = vfmadd231ps_fma(auVar199,auVar44,auVar59);
  auVar45 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar43,auVar36);
  auVar212._0_4_ = auVar10._0_4_ + auVar45._0_4_;
  auVar212._4_4_ = auVar10._4_4_ + auVar45._4_4_;
  auVar212._8_4_ = auVar10._8_4_ + auVar45._8_4_;
  auVar212._12_4_ = auVar10._12_4_ + auVar45._12_4_;
  auVar45 = vfmadd231ps_avx512vl(auVar36,auVar43,auVar129);
  auVar47 = vfnmadd231ps_avx512vl(auVar45,auVar10,auVar129);
  auVar45 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar42,auVar34);
  auVar45 = vfmadd231ps_fma(auVar45,auVar41,auVar59);
  auVar11 = vfmadd231ps_fma(auVar45,auVar38,auVar59);
  auVar34 = vmulps_avx512vl(auVar34,auVar129);
  auVar34 = vfnmadd231ps_avx512vl(auVar34,auVar129,auVar42);
  auVar34 = vfmadd231ps_fma(auVar34,auVar59,auVar41);
  auVar41 = vfnmadd231ps_fma(auVar34,auVar59,auVar38);
  auVar38 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar44,auVar35);
  auVar38 = vfmadd231ps_fma(auVar38,auVar43,auVar59);
  auVar45 = vfmadd231ps_fma(auVar38,auVar10,auVar59);
  auVar38 = vmulps_avx512vl(auVar35,auVar129);
  auVar38 = vfnmadd231ps_avx512vl(auVar38,auVar129,auVar44);
  auVar38 = vfmadd231ps_fma(auVar38,auVar59,auVar43);
  auVar36 = vfnmadd231ps_fma(auVar38,auVar59,auVar10);
  auVar38 = vshufps_avx(auVar46,auVar46,0xc9);
  auVar34 = vshufps_avx(auVar212,auVar212,0xc9);
  fVar122 = auVar46._0_4_;
  auVar72._0_4_ = fVar122 * auVar34._0_4_;
  fVar126 = auVar46._4_4_;
  auVar72._4_4_ = fVar126 * auVar34._4_4_;
  fVar127 = auVar46._8_4_;
  auVar72._8_4_ = fVar127 * auVar34._8_4_;
  fVar128 = auVar46._12_4_;
  auVar72._12_4_ = fVar128 * auVar34._12_4_;
  auVar34 = vfmsub231ps_fma(auVar72,auVar38,auVar212);
  auVar10 = vshufps_avx(auVar34,auVar34,0xc9);
  auVar34 = vshufps_avx(auVar47,auVar47,0xc9);
  auVar78._0_4_ = auVar34._0_4_ * fVar122;
  auVar78._4_4_ = auVar34._4_4_ * fVar126;
  auVar78._8_4_ = auVar34._8_4_ * fVar127;
  auVar78._12_4_ = auVar34._12_4_ * fVar128;
  auVar38 = vfmsub231ps_fma(auVar78,auVar38,auVar47);
  auVar35 = vshufps_avx(auVar38,auVar38,0xc9);
  auVar38 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar34 = vshufps_avx(auVar45,auVar45,0xc9);
  fVar121 = auVar41._0_4_;
  auVar177._0_4_ = auVar34._0_4_ * fVar121;
  fVar197 = auVar41._4_4_;
  auVar177._4_4_ = auVar34._4_4_ * fVar197;
  fVar186 = auVar41._8_4_;
  auVar177._8_4_ = auVar34._8_4_ * fVar186;
  fVar195 = auVar41._12_4_;
  auVar177._12_4_ = auVar34._12_4_ * fVar195;
  auVar34 = vfmsub231ps_fma(auVar177,auVar38,auVar45);
  auVar45 = vshufps_avx(auVar34,auVar34,0xc9);
  auVar34 = vshufps_avx(auVar36,auVar36,0xc9);
  auVar178._0_4_ = auVar34._0_4_ * fVar121;
  auVar178._4_4_ = auVar34._4_4_ * fVar197;
  auVar178._8_4_ = auVar34._8_4_ * fVar186;
  auVar178._12_4_ = auVar34._12_4_ * fVar195;
  auVar38 = vfmsub231ps_fma(auVar178,auVar38,auVar36);
  auVar36 = vshufps_avx(auVar38,auVar38,0xc9);
  auVar38 = vdpps_avx(auVar10,auVar10,0x7f);
  fVar196 = auVar38._0_4_;
  auVar179._4_12_ = ZEXT812(0) << 0x20;
  auVar179._0_4_ = fVar196;
  auVar34 = vrsqrt14ss_avx512f(auVar59,auVar179);
  auVar42 = vmulss_avx512f(auVar34,ZEXT416(0x3fc00000));
  auVar43 = vmulss_avx512f(auVar38,ZEXT416(0x3f000000));
  fVar144 = auVar34._0_4_;
  fVar147 = auVar42._0_4_ - auVar43._0_4_ * fVar144 * fVar144 * fVar144;
  auVar34 = vdpps_avx(auVar10,auVar35,0x7f);
  fVar211 = fVar147 * auVar10._0_4_;
  fVar219 = fVar147 * auVar10._4_4_;
  fVar220 = fVar147 * auVar10._8_4_;
  fVar221 = fVar147 * auVar10._12_4_;
  auVar80._0_4_ = fVar196 * auVar35._0_4_;
  auVar80._4_4_ = fVar196 * auVar35._4_4_;
  auVar80._8_4_ = fVar196 * auVar35._8_4_;
  auVar80._12_4_ = fVar196 * auVar35._12_4_;
  fVar196 = auVar34._0_4_;
  auVar73._0_4_ = fVar196 * auVar10._0_4_;
  auVar73._4_4_ = fVar196 * auVar10._4_4_;
  auVar73._8_4_ = fVar196 * auVar10._8_4_;
  auVar73._12_4_ = fVar196 * auVar10._12_4_;
  auVar10 = vsubps_avx(auVar80,auVar73);
  auVar34 = vrcp14ss_avx512f(auVar59,auVar179);
  auVar38 = vfnmadd213ss_avx512f(auVar38,auVar34,ZEXT416(0x40000000));
  fVar196 = auVar34._0_4_ * auVar38._0_4_;
  auVar38 = vdpps_avx(auVar45,auVar45,0x7f);
  fVar144 = auVar38._0_4_;
  auVar81._4_12_ = ZEXT812(0) << 0x20;
  auVar81._0_4_ = fVar144;
  auVar34 = vrsqrt14ss_avx512f(auVar59,auVar81);
  auVar35 = vmulss_avx512f(auVar34,ZEXT416(0x3fc00000));
  auVar42 = vmulss_avx512f(auVar38,ZEXT416(0x3f000000));
  fVar148 = auVar34._0_4_;
  fVar148 = auVar35._0_4_ - auVar42._0_4_ * fVar148 * fVar148 * fVar148;
  auVar34 = vdpps_avx(auVar45,auVar36,0x7f);
  fVar198 = fVar148 * auVar45._0_4_;
  fVar208 = fVar148 * auVar45._4_4_;
  fVar209 = fVar148 * auVar45._8_4_;
  fVar210 = fVar148 * auVar45._12_4_;
  auVar67._0_4_ = fVar144 * auVar36._0_4_;
  auVar67._4_4_ = fVar144 * auVar36._4_4_;
  auVar67._8_4_ = fVar144 * auVar36._8_4_;
  auVar67._12_4_ = fVar144 * auVar36._12_4_;
  fVar144 = auVar34._0_4_;
  auVar66._0_4_ = fVar144 * auVar45._0_4_;
  auVar66._4_4_ = fVar144 * auVar45._4_4_;
  auVar66._8_4_ = fVar144 * auVar45._8_4_;
  auVar66._12_4_ = fVar144 * auVar45._12_4_;
  auVar35 = vsubps_avx(auVar67,auVar66);
  auVar34 = vrcp14ss_avx512f(auVar59,auVar81);
  auVar38 = vfnmadd213ss_avx512f(auVar38,auVar34,ZEXT416(0x40000000));
  fVar144 = auVar38._0_4_ * auVar34._0_4_;
  auVar38 = vshufps_avx(auVar61,auVar61,0xff);
  auVar74._0_4_ = fVar211 * auVar38._0_4_;
  auVar74._4_4_ = fVar219 * auVar38._4_4_;
  auVar74._8_4_ = fVar220 * auVar38._8_4_;
  auVar74._12_4_ = fVar221 * auVar38._12_4_;
  auVar45 = vsubps_avx(auVar61,auVar74);
  auVar34 = vshufps_avx(auVar46,auVar46,0xff);
  auVar68._0_4_ = auVar34._0_4_ * fVar211 + auVar38._0_4_ * fVar147 * fVar196 * auVar10._0_4_;
  auVar68._4_4_ = auVar34._4_4_ * fVar219 + auVar38._4_4_ * fVar147 * fVar196 * auVar10._4_4_;
  auVar68._8_4_ = auVar34._8_4_ * fVar220 + auVar38._8_4_ * fVar147 * fVar196 * auVar10._8_4_;
  auVar68._12_4_ = auVar34._12_4_ * fVar221 + auVar38._12_4_ * fVar147 * fVar196 * auVar10._12_4_;
  auVar10 = vsubps_avx(auVar46,auVar68);
  auVar213._0_4_ = auVar74._0_4_ + auVar61._0_4_;
  auVar213._4_4_ = auVar74._4_4_ + auVar61._4_4_;
  auVar213._8_4_ = auVar74._8_4_ + auVar61._8_4_;
  auVar213._12_4_ = auVar74._12_4_ + auVar61._12_4_;
  auVar56._0_4_ = fVar122 + auVar68._0_4_;
  auVar56._4_4_ = fVar126 + auVar68._4_4_;
  auVar56._8_4_ = fVar127 + auVar68._8_4_;
  auVar56._12_4_ = fVar128 + auVar68._12_4_;
  auVar38 = vshufps_avx(auVar11,auVar11,0xff);
  auVar69._0_4_ = fVar198 * auVar38._0_4_;
  auVar69._4_4_ = fVar208 * auVar38._4_4_;
  auVar69._8_4_ = fVar209 * auVar38._8_4_;
  auVar69._12_4_ = fVar210 * auVar38._12_4_;
  auVar36 = vsubps_avx(auVar11,auVar69);
  auVar34 = vshufps_avx(auVar41,auVar41,0xff);
  auVar62._0_4_ = auVar34._0_4_ * fVar198 + auVar38._0_4_ * fVar148 * auVar35._0_4_ * fVar144;
  auVar62._4_4_ = auVar34._4_4_ * fVar208 + auVar38._4_4_ * fVar148 * auVar35._4_4_ * fVar144;
  auVar62._8_4_ = auVar34._8_4_ * fVar209 + auVar38._8_4_ * fVar148 * auVar35._8_4_ * fVar144;
  auVar62._12_4_ = auVar34._12_4_ * fVar210 + auVar38._12_4_ * fVar148 * auVar35._12_4_ * fVar144;
  auVar38 = vsubps_avx(auVar41,auVar62);
  auVar48 = vaddps_avx512vl(auVar11,auVar69);
  auVar63._0_4_ = fVar121 + auVar62._0_4_;
  auVar63._4_4_ = fVar197 + auVar62._4_4_;
  auVar63._8_4_ = fVar186 + auVar62._8_4_;
  auVar63._12_4_ = fVar195 + auVar62._12_4_;
  auVar34 = vmulps_avx512vl(auVar10,auVar40);
  auVar49 = vaddps_avx512vl(auVar45,auVar34);
  auVar38 = vmulps_avx512vl(auVar38,auVar40);
  auVar50 = vsubps_avx512vl(auVar36,auVar38);
  auVar38 = vmulps_avx512vl(auVar56,auVar40);
  auVar51 = vaddps_avx512vl(auVar213,auVar38);
  auVar38 = vmulps_avx512vl(auVar63,auVar40);
  auVar52 = vsubps_avx512vl(auVar48,auVar38);
  auVar11 = vsubps_avx(auVar45,auVar58);
  uVar123 = auVar11._0_4_;
  auVar64._4_4_ = uVar123;
  auVar64._0_4_ = uVar123;
  auVar64._8_4_ = uVar123;
  auVar64._12_4_ = uVar123;
  auVar38 = vshufps_avx(auVar11,auVar11,0x55);
  auVar34 = vshufps_avx(auVar11,auVar11,0xaa);
  aVar2 = pre->ray_space[k].vx.field_0;
  aVar3 = pre->ray_space[k].vy.field_0;
  fVar121 = pre->ray_space[k].vz.field_0.m128[0];
  fVar197 = pre->ray_space[k].vz.field_0.m128[1];
  fVar186 = pre->ray_space[k].vz.field_0.m128[2];
  fVar195 = pre->ray_space[k].vz.field_0.m128[3];
  auVar57._0_4_ = fVar121 * auVar34._0_4_;
  auVar57._4_4_ = fVar197 * auVar34._4_4_;
  auVar57._8_4_ = fVar186 * auVar34._8_4_;
  auVar57._12_4_ = fVar195 * auVar34._12_4_;
  auVar38 = vfmadd231ps_fma(auVar57,(undefined1  [16])aVar3,auVar38);
  auVar44 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar2,auVar64);
  auVar53 = vsubps_avx512vl(auVar49,auVar58);
  uVar123 = auVar53._0_4_;
  auVar137._4_4_ = uVar123;
  auVar137._0_4_ = uVar123;
  auVar137._8_4_ = uVar123;
  auVar137._12_4_ = uVar123;
  auVar38 = vshufps_avx(auVar53,auVar53,0x55);
  auVar34 = vshufps_avx(auVar53,auVar53,0xaa);
  auVar65._0_4_ = fVar121 * auVar34._0_4_;
  auVar65._4_4_ = fVar197 * auVar34._4_4_;
  auVar65._8_4_ = fVar186 * auVar34._8_4_;
  auVar65._12_4_ = fVar195 * auVar34._12_4_;
  auVar38 = vfmadd231ps_fma(auVar65,(undefined1  [16])aVar3,auVar38);
  auVar46 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar2,auVar137);
  auVar54 = vsubps_avx512vl(auVar50,auVar58);
  uVar123 = auVar54._0_4_;
  auVar79._4_4_ = uVar123;
  auVar79._0_4_ = uVar123;
  auVar79._8_4_ = uVar123;
  auVar79._12_4_ = uVar123;
  auVar38 = vshufps_avx(auVar54,auVar54,0x55);
  auVar34 = vshufps_avx(auVar54,auVar54,0xaa);
  auVar138._0_4_ = fVar121 * auVar34._0_4_;
  auVar138._4_4_ = fVar197 * auVar34._4_4_;
  auVar138._8_4_ = fVar186 * auVar34._8_4_;
  auVar138._12_4_ = fVar195 * auVar34._12_4_;
  auVar38 = vfmadd231ps_fma(auVar138,(undefined1  [16])aVar3,auVar38);
  auVar47 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar2,auVar79);
  auVar41 = vsubps_avx(auVar36,auVar58);
  uVar123 = auVar41._0_4_;
  auVar75._4_4_ = uVar123;
  auVar75._0_4_ = uVar123;
  auVar75._8_4_ = uVar123;
  auVar75._12_4_ = uVar123;
  auVar38 = vshufps_avx(auVar41,auVar41,0x55);
  auVar34 = vshufps_avx(auVar41,auVar41,0xaa);
  auVar82._0_4_ = fVar121 * auVar34._0_4_;
  auVar82._4_4_ = fVar197 * auVar34._4_4_;
  auVar82._8_4_ = fVar186 * auVar34._8_4_;
  auVar82._12_4_ = fVar195 * auVar34._12_4_;
  auVar38 = vfmadd231ps_fma(auVar82,(undefined1  [16])aVar3,auVar38);
  auVar59 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar2,auVar75);
  auVar40 = vsubps_avx(auVar213,auVar58);
  uVar123 = auVar40._0_4_;
  auVar164._4_4_ = uVar123;
  auVar164._0_4_ = uVar123;
  auVar164._8_4_ = uVar123;
  auVar164._12_4_ = uVar123;
  auVar38 = vshufps_avx(auVar40,auVar40,0x55);
  auVar34 = vshufps_avx(auVar40,auVar40,0xaa);
  auVar180._0_4_ = auVar34._0_4_ * fVar121;
  auVar180._4_4_ = auVar34._4_4_ * fVar197;
  auVar180._8_4_ = auVar34._8_4_ * fVar186;
  auVar180._12_4_ = auVar34._12_4_ * fVar195;
  auVar38 = vfmadd231ps_fma(auVar180,(undefined1  [16])aVar3,auVar38);
  auVar129 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar2,auVar164);
  auVar55 = vsubps_avx512vl(auVar51,auVar58);
  uVar123 = auVar55._0_4_;
  auVar70._4_4_ = uVar123;
  auVar70._0_4_ = uVar123;
  auVar70._8_4_ = uVar123;
  auVar70._12_4_ = uVar123;
  auVar38 = vshufps_avx(auVar55,auVar55,0x55);
  auVar34 = vshufps_avx(auVar55,auVar55,0xaa);
  auVar187._0_4_ = auVar34._0_4_ * fVar121;
  auVar187._4_4_ = auVar34._4_4_ * fVar197;
  auVar187._8_4_ = auVar34._8_4_ * fVar186;
  auVar187._12_4_ = auVar34._12_4_ * fVar195;
  auVar38 = vfmadd231ps_fma(auVar187,(undefined1  [16])aVar3,auVar38);
  auVar134 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar2,auVar70);
  auVar56 = vsubps_avx512vl(auVar52,auVar58);
  uVar123 = auVar56._0_4_;
  auVar71._4_4_ = uVar123;
  auVar71._0_4_ = uVar123;
  auVar71._8_4_ = uVar123;
  auVar71._12_4_ = uVar123;
  auVar38 = vshufps_avx(auVar56,auVar56,0x55);
  auVar34 = vshufps_avx(auVar56,auVar56,0xaa);
  auVar200._0_4_ = auVar34._0_4_ * fVar121;
  auVar200._4_4_ = auVar34._4_4_ * fVar197;
  auVar200._8_4_ = auVar34._8_4_ * fVar186;
  auVar200._12_4_ = auVar34._12_4_ * fVar195;
  auVar38 = vfmadd231ps_fma(auVar200,(undefined1  [16])aVar3,auVar38);
  auVar135 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar2,auVar71);
  auVar57 = vsubps_avx512vl(auVar48,auVar58);
  uVar123 = auVar57._0_4_;
  auVar60._4_4_ = uVar123;
  auVar60._0_4_ = uVar123;
  auVar60._8_4_ = uVar123;
  auVar60._12_4_ = uVar123;
  auVar38 = vshufps_avx(auVar57,auVar57,0x55);
  auVar34 = vshufps_avx(auVar57,auVar57,0xaa);
  auVar76._0_4_ = auVar34._0_4_ * fVar121;
  auVar76._4_4_ = auVar34._4_4_ * fVar197;
  auVar76._8_4_ = auVar34._8_4_ * fVar186;
  auVar76._12_4_ = auVar34._12_4_ * fVar195;
  auVar38 = vfmadd231ps_fma(auVar76,(undefined1  [16])aVar3,auVar38);
  auVar136 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar2,auVar60);
  auVar10 = vmovlhps_avx(auVar44,auVar129);
  auVar35 = vmovlhps_avx(auVar46,auVar134);
  auVar42 = vmovlhps_avx512f(auVar47,auVar135);
  auVar43 = vmovlhps_avx512f(auVar59,auVar136);
  auVar34 = vminps_avx(auVar10,auVar35);
  auVar38 = vmaxps_avx(auVar10,auVar35);
  auVar58 = vminps_avx512vl(auVar42,auVar43);
  auVar34 = vminps_avx(auVar34,auVar58);
  auVar58 = vmaxps_avx512vl(auVar42,auVar43);
  auVar38 = vmaxps_avx(auVar38,auVar58);
  auVar58 = vshufpd_avx(auVar34,auVar34,3);
  auVar34 = vminps_avx(auVar34,auVar58);
  auVar58 = vshufpd_avx(auVar38,auVar38,3);
  auVar38 = vmaxps_avx(auVar38,auVar58);
  auVar34 = vandps_avx512vl(auVar34,auVar235._0_16_);
  auVar38 = vandps_avx512vl(auVar38,auVar235._0_16_);
  auVar38 = vmaxps_avx(auVar34,auVar38);
  auVar34 = vmovshdup_avx(auVar38);
  auVar38 = vmaxss_avx(auVar34,auVar38);
  local_350 = uVar28 + 0xf;
  fVar121 = auVar38._0_4_ * 9.536743e-07;
  auVar44 = vmovddup_avx512vl(auVar44);
  auVar46 = vmovddup_avx512vl(auVar46);
  auVar47 = vmovddup_avx512vl(auVar47);
  auVar124._8_8_ = auVar59._0_8_;
  auVar124._0_8_ = auVar59._0_8_;
  auVar83 = vbroadcastss_avx512vl(ZEXT416((uint)fVar121));
  auVar38 = vxorps_avx512vl(auVar83._0_16_,auVar231._0_16_);
  local_78 = auVar38._0_4_;
  uStack_74 = local_78;
  uStack_70 = local_78;
  uStack_6c = local_78;
  uStack_68 = local_78;
  uStack_64 = local_78;
  uStack_60 = local_78;
  uStack_5c = local_78;
  uVar24 = 0;
  auVar38 = vsubps_avx(auVar35,auVar10);
  auVar59 = vsubps_avx512vl(auVar42,auVar35);
  auVar60 = vsubps_avx512vl(auVar43,auVar42);
  auVar34 = vsubps_avx(auVar213,auVar45);
  auVar61 = vsubps_avx512vl(auVar51,auVar49);
  auVar62 = vsubps_avx512vl(auVar52,auVar50);
  auVar63 = vsubps_avx512vl(auVar48,auVar36);
  auVar64 = vpbroadcastd_avx512vl();
  auVar65 = vpbroadcastd_avx512vl();
  auVar58 = ZEXT816(0x3f80000000000000);
  auVar77 = auVar58;
LAB_017dc0d0:
  do {
    auVar137 = vshufps_avx(auVar77,auVar77,0x50);
    auVar222._8_4_ = 0x3f800000;
    auVar222._0_8_ = 0x3f8000003f800000;
    auVar222._12_4_ = 0x3f800000;
    auVar104._16_4_ = 0x3f800000;
    auVar104._0_16_ = auVar222;
    auVar104._20_4_ = 0x3f800000;
    auVar104._24_4_ = 0x3f800000;
    auVar104._28_4_ = 0x3f800000;
    auVar138 = vsubps_avx(auVar222,auVar137);
    fVar197 = auVar137._0_4_;
    fVar144 = auVar129._0_4_;
    auVar145._0_4_ = fVar144 * fVar197;
    fVar186 = auVar137._4_4_;
    fVar147 = auVar129._4_4_;
    auVar145._4_4_ = fVar147 * fVar186;
    fVar195 = auVar137._8_4_;
    auVar145._8_4_ = fVar144 * fVar195;
    fVar196 = auVar137._12_4_;
    auVar145._12_4_ = fVar147 * fVar196;
    fVar148 = auVar134._0_4_;
    auVar149._0_4_ = fVar148 * fVar197;
    fVar122 = auVar134._4_4_;
    auVar149._4_4_ = fVar122 * fVar186;
    auVar149._8_4_ = fVar148 * fVar195;
    auVar149._12_4_ = fVar122 * fVar196;
    fVar126 = auVar135._0_4_;
    auVar155._0_4_ = fVar126 * fVar197;
    fVar127 = auVar135._4_4_;
    auVar155._4_4_ = fVar127 * fVar186;
    auVar155._8_4_ = fVar126 * fVar195;
    auVar155._12_4_ = fVar127 * fVar196;
    fVar128 = auVar136._0_4_;
    auVar130._0_4_ = fVar128 * fVar197;
    fVar198 = auVar136._4_4_;
    auVar130._4_4_ = fVar198 * fVar186;
    auVar130._8_4_ = fVar128 * fVar195;
    auVar130._12_4_ = fVar198 * fVar196;
    auVar66 = vfmadd231ps_avx512vl(auVar145,auVar138,auVar44);
    auVar67 = vfmadd231ps_avx512vl(auVar149,auVar138,auVar46);
    auVar68 = vfmadd231ps_avx512vl(auVar155,auVar138,auVar47);
    auVar138 = vfmadd231ps_fma(auVar130,auVar124,auVar138);
    auVar137 = vmovshdup_avx(auVar58);
    fVar186 = auVar58._0_4_;
    fVar197 = (auVar137._0_4_ - fVar186) * 0.04761905;
    auVar98._4_4_ = fVar186;
    auVar98._0_4_ = fVar186;
    auVar98._8_4_ = fVar186;
    auVar98._12_4_ = fVar186;
    auVar98._16_4_ = fVar186;
    auVar98._20_4_ = fVar186;
    auVar98._24_4_ = fVar186;
    auVar98._28_4_ = fVar186;
    auVar88._0_8_ = auVar137._0_8_;
    auVar88._8_8_ = auVar88._0_8_;
    auVar88._16_8_ = auVar88._0_8_;
    auVar88._24_8_ = auVar88._0_8_;
    auVar101 = vsubps_avx(auVar88,auVar98);
    uVar123 = auVar66._0_4_;
    auVar102._4_4_ = uVar123;
    auVar102._0_4_ = uVar123;
    auVar102._8_4_ = uVar123;
    auVar102._12_4_ = uVar123;
    auVar102._16_4_ = uVar123;
    auVar102._20_4_ = uVar123;
    auVar102._24_4_ = uVar123;
    auVar102._28_4_ = uVar123;
    auVar90._8_4_ = 1;
    auVar90._0_8_ = 0x100000001;
    auVar90._12_4_ = 1;
    auVar90._16_4_ = 1;
    auVar90._20_4_ = 1;
    auVar90._24_4_ = 1;
    auVar90._28_4_ = 1;
    auVar100 = ZEXT1632(auVar66);
    auVar99 = vpermps_avx2(auVar90,auVar100);
    auVar84 = vbroadcastss_avx512vl(auVar67);
    auVar94 = ZEXT1632(auVar67);
    auVar85 = vpermps_avx512vl(auVar90,auVar94);
    auVar86 = vbroadcastss_avx512vl(auVar68);
    auVar95 = ZEXT1632(auVar68);
    auVar87 = vpermps_avx512vl(auVar90,auVar95);
    auVar88 = vbroadcastss_avx512vl(auVar138);
    auVar97 = ZEXT1632(auVar138);
    auVar89 = vpermps_avx512vl(auVar90,auVar97);
    auVar103._4_4_ = fVar197;
    auVar103._0_4_ = fVar197;
    auVar103._8_4_ = fVar197;
    auVar103._12_4_ = fVar197;
    auVar103._16_4_ = fVar197;
    auVar103._20_4_ = fVar197;
    auVar103._24_4_ = fVar197;
    auVar103._28_4_ = fVar197;
    auVar96._8_4_ = 2;
    auVar96._0_8_ = 0x200000002;
    auVar96._12_4_ = 2;
    auVar96._16_4_ = 2;
    auVar96._20_4_ = 2;
    auVar96._24_4_ = 2;
    auVar96._28_4_ = 2;
    auVar90 = vpermps_avx512vl(auVar96,auVar100);
    auVar91 = vbroadcastss_avx512vl(ZEXT416(3));
    auVar92 = vpermps_avx512vl(auVar91,auVar100);
    auVar93 = vpermps_avx512vl(auVar96,auVar94);
    auVar94 = vpermps_avx512vl(auVar91,auVar94);
    auVar100 = vpermps_avx2(auVar96,auVar95);
    auVar95 = vpermps_avx512vl(auVar91,auVar95);
    auVar96 = vpermps_avx512vl(auVar96,auVar97);
    auVar91 = vpermps_avx512vl(auVar91,auVar97);
    auVar137 = vfmadd132ps_fma(auVar101,auVar98,_DAT_01f7b040);
    auVar101 = vsubps_avx(auVar104,ZEXT1632(auVar137));
    auVar97 = vmulps_avx512vl(auVar84,ZEXT1632(auVar137));
    auVar104 = ZEXT1632(auVar137);
    auVar98 = vmulps_avx512vl(auVar85,auVar104);
    auVar138 = vfmadd231ps_fma(auVar97,auVar101,auVar102);
    auVar66 = vfmadd231ps_fma(auVar98,auVar101,auVar99);
    auVar97 = vmulps_avx512vl(auVar86,auVar104);
    auVar98 = vmulps_avx512vl(auVar87,auVar104);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar101,auVar84);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar101,auVar85);
    auVar84 = vmulps_avx512vl(auVar88,auVar104);
    auVar102 = ZEXT1632(auVar137);
    auVar85 = vmulps_avx512vl(auVar89,auVar102);
    auVar86 = vfmadd231ps_avx512vl(auVar84,auVar101,auVar86);
    auVar87 = vfmadd231ps_avx512vl(auVar85,auVar101,auVar87);
    fVar195 = auVar137._0_4_;
    fVar196 = auVar137._4_4_;
    auVar84._4_4_ = fVar196 * auVar97._4_4_;
    auVar84._0_4_ = fVar195 * auVar97._0_4_;
    fVar208 = auVar137._8_4_;
    auVar84._8_4_ = fVar208 * auVar97._8_4_;
    fVar209 = auVar137._12_4_;
    auVar84._12_4_ = fVar209 * auVar97._12_4_;
    auVar84._16_4_ = auVar97._16_4_ * 0.0;
    auVar84._20_4_ = auVar97._20_4_ * 0.0;
    auVar84._24_4_ = auVar97._24_4_ * 0.0;
    auVar84._28_4_ = fVar186;
    auVar85._4_4_ = fVar196 * auVar98._4_4_;
    auVar85._0_4_ = fVar195 * auVar98._0_4_;
    auVar85._8_4_ = fVar208 * auVar98._8_4_;
    auVar85._12_4_ = fVar209 * auVar98._12_4_;
    auVar85._16_4_ = auVar98._16_4_ * 0.0;
    auVar85._20_4_ = auVar98._20_4_ * 0.0;
    auVar85._24_4_ = auVar98._24_4_ * 0.0;
    auVar85._28_4_ = auVar99._28_4_;
    auVar138 = vfmadd231ps_fma(auVar84,auVar101,ZEXT1632(auVar138));
    auVar66 = vfmadd231ps_fma(auVar85,auVar101,ZEXT1632(auVar66));
    auVar89._0_4_ = fVar195 * auVar86._0_4_;
    auVar89._4_4_ = fVar196 * auVar86._4_4_;
    auVar89._8_4_ = fVar208 * auVar86._8_4_;
    auVar89._12_4_ = fVar209 * auVar86._12_4_;
    auVar89._16_4_ = auVar86._16_4_ * 0.0;
    auVar89._20_4_ = auVar86._20_4_ * 0.0;
    auVar89._24_4_ = auVar86._24_4_ * 0.0;
    auVar89._28_4_ = 0;
    auVar99._4_4_ = fVar196 * auVar87._4_4_;
    auVar99._0_4_ = fVar195 * auVar87._0_4_;
    auVar99._8_4_ = fVar208 * auVar87._8_4_;
    auVar99._12_4_ = fVar209 * auVar87._12_4_;
    auVar99._16_4_ = auVar87._16_4_ * 0.0;
    auVar99._20_4_ = auVar87._20_4_ * 0.0;
    auVar99._24_4_ = auVar87._24_4_ * 0.0;
    auVar99._28_4_ = auVar86._28_4_;
    auVar67 = vfmadd231ps_fma(auVar89,auVar101,auVar97);
    auVar68 = vfmadd231ps_fma(auVar99,auVar101,auVar98);
    auVar86._28_4_ = auVar98._28_4_;
    auVar86._0_28_ =
         ZEXT1628(CONCAT412(fVar209 * auVar68._12_4_,
                            CONCAT48(fVar208 * auVar68._8_4_,
                                     CONCAT44(fVar196 * auVar68._4_4_,fVar195 * auVar68._0_4_))));
    auVar69 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar209 * auVar67._12_4_,
                                                 CONCAT48(fVar208 * auVar67._8_4_,
                                                          CONCAT44(fVar196 * auVar67._4_4_,
                                                                   fVar195 * auVar67._0_4_)))),
                              auVar101,ZEXT1632(auVar138));
    auVar79 = vfmadd231ps_fma(auVar86,auVar101,ZEXT1632(auVar66));
    auVar99 = vsubps_avx(ZEXT1632(auVar67),ZEXT1632(auVar138));
    auVar84 = vsubps_avx(ZEXT1632(auVar68),ZEXT1632(auVar66));
    auVar85 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar99 = vmulps_avx512vl(auVar99,auVar85);
    auVar84 = vmulps_avx512vl(auVar84,auVar85);
    auVar97._0_4_ = fVar197 * auVar99._0_4_;
    auVar97._4_4_ = fVar197 * auVar99._4_4_;
    auVar97._8_4_ = fVar197 * auVar99._8_4_;
    auVar97._12_4_ = fVar197 * auVar99._12_4_;
    auVar97._16_4_ = fVar197 * auVar99._16_4_;
    auVar97._20_4_ = fVar197 * auVar99._20_4_;
    auVar97._24_4_ = fVar197 * auVar99._24_4_;
    auVar97._28_4_ = 0;
    auVar99 = vmulps_avx512vl(auVar103,auVar84);
    auVar66 = vxorps_avx512vl(auVar88._0_16_,auVar88._0_16_);
    auVar84 = vpermt2ps_avx512vl(ZEXT1632(auVar69),_DAT_01fb9fc0,ZEXT1632(auVar66));
    auVar86 = vpermt2ps_avx512vl(ZEXT1632(auVar79),_DAT_01fb9fc0,ZEXT1632(auVar66));
    auVar133._0_4_ = auVar97._0_4_ + auVar69._0_4_;
    auVar133._4_4_ = auVar97._4_4_ + auVar69._4_4_;
    auVar133._8_4_ = auVar97._8_4_ + auVar69._8_4_;
    auVar133._12_4_ = auVar97._12_4_ + auVar69._12_4_;
    auVar133._16_4_ = auVar97._16_4_ + 0.0;
    auVar133._20_4_ = auVar97._20_4_ + 0.0;
    auVar133._24_4_ = auVar97._24_4_ + 0.0;
    auVar133._28_4_ = 0;
    auVar98 = ZEXT1632(auVar66);
    auVar87 = vpermt2ps_avx512vl(auVar97,_DAT_01fb9fc0,auVar98);
    auVar88 = vaddps_avx512vl(ZEXT1632(auVar79),auVar99);
    auVar89 = vpermt2ps_avx512vl(auVar99,_DAT_01fb9fc0,auVar98);
    auVar99 = vsubps_avx(auVar84,auVar87);
    auVar89 = vsubps_avx512vl(auVar86,auVar89);
    auVar87 = vmulps_avx512vl(auVar93,auVar102);
    auVar97 = vmulps_avx512vl(auVar94,auVar102);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar101,auVar90);
    auVar90 = vfmadd231ps_avx512vl(auVar97,auVar101,auVar92);
    auVar92 = vmulps_avx512vl(auVar100,auVar102);
    auVar97 = vmulps_avx512vl(auVar95,auVar102);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar101,auVar93);
    auVar93 = vfmadd231ps_avx512vl(auVar97,auVar101,auVar94);
    auVar94 = vmulps_avx512vl(auVar96,auVar102);
    auVar91 = vmulps_avx512vl(auVar91,auVar102);
    auVar138 = vfmadd231ps_fma(auVar94,auVar101,auVar100);
    auVar100 = vfmadd231ps_avx512vl(auVar91,auVar101,auVar95);
    auVar91 = vmulps_avx512vl(auVar102,auVar92);
    auVar96 = ZEXT1632(auVar137);
    auVar94 = vmulps_avx512vl(auVar96,auVar93);
    auVar87 = vfmadd231ps_avx512vl(auVar91,auVar101,auVar87);
    auVar90 = vfmadd231ps_avx512vl(auVar94,auVar101,auVar90);
    auVar100 = vmulps_avx512vl(auVar96,auVar100);
    auVar91 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar209 * auVar138._12_4_,
                                            CONCAT48(fVar208 * auVar138._8_4_,
                                                     CONCAT44(fVar196 * auVar138._4_4_,
                                                              fVar195 * auVar138._0_4_)))),auVar101,
                         auVar92);
    auVar92 = vfmadd231ps_avx512vl(auVar100,auVar101,auVar93);
    auVar100._4_4_ = fVar196 * auVar91._4_4_;
    auVar100._0_4_ = fVar195 * auVar91._0_4_;
    auVar100._8_4_ = fVar208 * auVar91._8_4_;
    auVar100._12_4_ = fVar209 * auVar91._12_4_;
    auVar100._16_4_ = auVar91._16_4_ * 0.0;
    auVar100._20_4_ = auVar91._20_4_ * 0.0;
    auVar100._24_4_ = auVar91._24_4_ * 0.0;
    auVar100._28_4_ = auVar95._28_4_;
    auVar93 = vmulps_avx512vl(auVar96,auVar92);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar101,auVar87);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar90,auVar101);
    auVar101 = vsubps_avx512vl(auVar91,auVar87);
    auVar87 = vsubps_avx512vl(auVar92,auVar90);
    auVar90 = vmulps_avx512vl(auVar101,auVar85);
    auVar85 = vmulps_avx512vl(auVar87,auVar85);
    fVar186 = fVar197 * auVar90._0_4_;
    fVar195 = fVar197 * auVar90._4_4_;
    auVar101._4_4_ = fVar195;
    auVar101._0_4_ = fVar186;
    fVar196 = fVar197 * auVar90._8_4_;
    auVar101._8_4_ = fVar196;
    fVar208 = fVar197 * auVar90._12_4_;
    auVar101._12_4_ = fVar208;
    fVar209 = fVar197 * auVar90._16_4_;
    auVar101._16_4_ = fVar209;
    fVar210 = fVar197 * auVar90._20_4_;
    auVar101._20_4_ = fVar210;
    fVar197 = fVar197 * auVar90._24_4_;
    auVar101._24_4_ = fVar197;
    auVar101._28_4_ = auVar90._28_4_;
    auVar85 = vmulps_avx512vl(auVar103,auVar85);
    auVar91 = vpermt2ps_avx512vl(auVar100,_DAT_01fb9fc0,auVar98);
    auVar92 = vpermt2ps_avx512vl(auVar93,_DAT_01fb9fc0,auVar98);
    auVar185._0_4_ = auVar100._0_4_ + fVar186;
    auVar185._4_4_ = auVar100._4_4_ + fVar195;
    auVar185._8_4_ = auVar100._8_4_ + fVar196;
    auVar185._12_4_ = auVar100._12_4_ + fVar208;
    auVar185._16_4_ = auVar100._16_4_ + fVar209;
    auVar185._20_4_ = auVar100._20_4_ + fVar210;
    auVar185._24_4_ = auVar100._24_4_ + fVar197;
    auVar185._28_4_ = auVar100._28_4_ + auVar90._28_4_;
    auVar101 = vpermt2ps_avx512vl(auVar101,_DAT_01fb9fc0,ZEXT1632(auVar66));
    auVar90 = vaddps_avx512vl(auVar93,auVar85);
    auVar85 = vpermt2ps_avx512vl(auVar85,_DAT_01fb9fc0,ZEXT1632(auVar66));
    auVar101 = vsubps_avx(auVar91,auVar101);
    auVar85 = vsubps_avx512vl(auVar92,auVar85);
    auVar105 = ZEXT1632(auVar69);
    auVar87 = vsubps_avx512vl(auVar100,auVar105);
    auVar107 = ZEXT1632(auVar79);
    auVar94 = vsubps_avx512vl(auVar93,auVar107);
    auVar95 = vsubps_avx512vl(auVar91,auVar84);
    auVar87 = vaddps_avx512vl(auVar87,auVar95);
    auVar95 = vsubps_avx512vl(auVar92,auVar86);
    auVar94 = vaddps_avx512vl(auVar94,auVar95);
    auVar95 = vmulps_avx512vl(auVar107,auVar87);
    auVar95 = vfnmadd231ps_avx512vl(auVar95,auVar105,auVar94);
    auVar96 = vmulps_avx512vl(auVar88,auVar87);
    auVar96 = vfnmadd231ps_avx512vl(auVar96,auVar133,auVar94);
    auVar97 = vmulps_avx512vl(auVar89,auVar87);
    auVar97 = vfnmadd231ps_avx512vl(auVar97,auVar99,auVar94);
    auVar98 = vmulps_avx512vl(auVar86,auVar87);
    auVar98 = vfnmadd231ps_avx512vl(auVar98,auVar84,auVar94);
    auVar102 = vmulps_avx512vl(auVar93,auVar87);
    auVar102 = vfnmadd231ps_avx512vl(auVar102,auVar100,auVar94);
    auVar103 = vmulps_avx512vl(auVar90,auVar87);
    auVar103 = vfnmadd231ps_avx512vl(auVar103,auVar185,auVar94);
    auVar104 = vmulps_avx512vl(auVar85,auVar87);
    auVar104 = vfnmadd231ps_avx512vl(auVar104,auVar101,auVar94);
    auVar87 = vmulps_avx512vl(auVar92,auVar87);
    auVar87 = vfnmadd231ps_avx512vl(auVar87,auVar91,auVar94);
    auVar94 = vminps_avx512vl(auVar95,auVar96);
    auVar95 = vmaxps_avx512vl(auVar95,auVar96);
    auVar96 = vminps_avx512vl(auVar97,auVar98);
    auVar94 = vminps_avx512vl(auVar94,auVar96);
    auVar96 = vmaxps_avx512vl(auVar97,auVar98);
    auVar95 = vmaxps_avx512vl(auVar95,auVar96);
    auVar96 = vminps_avx512vl(auVar102,auVar103);
    auVar97 = vmaxps_avx512vl(auVar102,auVar103);
    auVar98 = vminps_avx512vl(auVar104,auVar87);
    auVar96 = vminps_avx512vl(auVar96,auVar98);
    auVar94 = vminps_avx512vl(auVar94,auVar96);
    auVar87 = vmaxps_avx512vl(auVar104,auVar87);
    auVar87 = vmaxps_avx512vl(auVar97,auVar87);
    auVar95 = vmaxps_avx512vl(auVar95,auVar87);
    uVar12 = vcmpps_avx512vl(auVar94,auVar83,2);
    auVar87._4_4_ = uStack_74;
    auVar87._0_4_ = local_78;
    auVar87._8_4_ = uStack_70;
    auVar87._12_4_ = uStack_6c;
    auVar87._16_4_ = uStack_68;
    auVar87._20_4_ = uStack_64;
    auVar87._24_4_ = uStack_60;
    auVar87._28_4_ = uStack_5c;
    uVar13 = vcmpps_avx512vl(auVar95,auVar87,5);
    bVar22 = (byte)uVar12 & (byte)uVar13 & 0x7f;
    if (bVar22 != 0) {
      auVar94 = vsubps_avx512vl(auVar84,auVar105);
      auVar95 = vsubps_avx512vl(auVar86,auVar107);
      auVar96 = vsubps_avx512vl(auVar91,auVar100);
      auVar94 = vaddps_avx512vl(auVar94,auVar96);
      auVar96 = vsubps_avx512vl(auVar92,auVar93);
      auVar95 = vaddps_avx512vl(auVar95,auVar96);
      auVar96 = vmulps_avx512vl(auVar107,auVar94);
      auVar96 = vfnmadd231ps_avx512vl(auVar96,auVar95,auVar105);
      auVar88 = vmulps_avx512vl(auVar88,auVar94);
      auVar88 = vfnmadd213ps_avx512vl(auVar133,auVar95,auVar88);
      auVar89 = vmulps_avx512vl(auVar89,auVar94);
      auVar89 = vfnmadd213ps_avx512vl(auVar99,auVar95,auVar89);
      auVar99 = vmulps_avx512vl(auVar86,auVar94);
      auVar86 = vfnmadd231ps_avx512vl(auVar99,auVar95,auVar84);
      auVar99 = vmulps_avx512vl(auVar93,auVar94);
      auVar93 = vfnmadd231ps_avx512vl(auVar99,auVar95,auVar100);
      auVar99 = vmulps_avx512vl(auVar90,auVar94);
      auVar90 = vfnmadd213ps_avx512vl(auVar185,auVar95,auVar99);
      auVar99 = vmulps_avx512vl(auVar85,auVar94);
      auVar97 = vfnmadd213ps_avx512vl(auVar101,auVar95,auVar99);
      auVar101 = vmulps_avx512vl(auVar92,auVar94);
      auVar91 = vfnmadd231ps_avx512vl(auVar101,auVar91,auVar95);
      auVar99 = vminps_avx(auVar96,auVar88);
      auVar101 = vmaxps_avx(auVar96,auVar88);
      auVar84 = vminps_avx(auVar89,auVar86);
      auVar84 = vminps_avx(auVar99,auVar84);
      auVar99 = vmaxps_avx(auVar89,auVar86);
      auVar101 = vmaxps_avx(auVar101,auVar99);
      auVar100 = vminps_avx(auVar93,auVar90);
      auVar99 = vmaxps_avx(auVar93,auVar90);
      auVar85 = vminps_avx(auVar97,auVar91);
      auVar100 = vminps_avx(auVar100,auVar85);
      auVar100 = vminps_avx(auVar84,auVar100);
      auVar84 = vmaxps_avx(auVar97,auVar91);
      auVar99 = vmaxps_avx(auVar99,auVar84);
      auVar101 = vmaxps_avx(auVar101,auVar99);
      uVar12 = vcmpps_avx512vl(auVar101,auVar87,5);
      uVar13 = vcmpps_avx512vl(auVar100,auVar83,2);
      bVar22 = bVar22 & (byte)uVar12 & (byte)uVar13;
      if (bVar22 != 0) {
        mask_stack[uVar24] = (uint)bVar22;
        BVar1 = (BBox1f)vmovlps_avx(auVar58);
        cu_stack[uVar24] = BVar1;
        BVar1 = (BBox1f)vmovlps_avx(auVar77);
        cv_stack[uVar24] = BVar1;
        uVar24 = (ulong)((int)uVar24 + 1);
      }
    }
    auVar58 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar230 = ZEXT1664(auVar58);
    auVar58 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar231 = ZEXT1664(auVar58);
    auVar101 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar232 = ZEXT3264(auVar101);
    auVar58 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar233 = ZEXT1664(auVar58);
    auVar234 = ZEXT3264(_DAT_01fb9fe0);
LAB_017dc5d9:
    do {
      do {
        do {
          auVar138 = auVar236._0_16_;
          auVar137 = auVar230._0_16_;
          if ((int)uVar24 == 0) {
            uVar123 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar17._4_4_ = uVar123;
            auVar17._0_4_ = uVar123;
            auVar17._8_4_ = uVar123;
            auVar17._12_4_ = uVar123;
            uVar12 = vcmpps_avx512vl(auVar39,auVar17,2);
            uVar28 = (ulong)((uint)uVar28 & (uint)local_350 & (uint)uVar12);
            goto LAB_017db9c9;
          }
          uVar23 = (int)uVar24 - 1;
          uVar5 = mask_stack[uVar23];
          auVar77._8_8_ = 0;
          auVar77._0_4_ = cv_stack[uVar23].lower;
          auVar77._4_4_ = cv_stack[uVar23].upper;
          uVar33 = 0;
          for (uVar27 = (ulong)uVar5; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000)
          {
            uVar33 = uVar33 + 1;
          }
          uVar26 = uVar5 - 1 & uVar5;
          bVar31 = uVar26 == 0;
          mask_stack[uVar23] = uVar26;
          if (bVar31) {
            uVar24 = (ulong)uVar23;
          }
          auVar117._8_8_ = 0;
          auVar117._0_8_ = uVar33;
          auVar58 = vpunpcklqdq_avx(auVar117,ZEXT416((int)uVar33 + 1));
          auVar58 = vcvtqq2ps_avx512vl(auVar58);
          auVar58 = vmulps_avx512vl(auVar58,auVar233._0_16_);
          fVar197 = cu_stack[uVar23].upper;
          auVar14._4_4_ = fVar197;
          auVar14._0_4_ = fVar197;
          auVar14._8_4_ = fVar197;
          auVar14._12_4_ = fVar197;
          auVar66 = vmulps_avx512vl(auVar58,auVar14);
          auVar58 = vsubps_avx512vl(auVar138,auVar58);
          fVar197 = cu_stack[uVar23].lower;
          auVar15._4_4_ = fVar197;
          auVar15._0_4_ = fVar197;
          auVar15._8_4_ = fVar197;
          auVar15._12_4_ = fVar197;
          auVar58 = vfmadd231ps_avx512vl(auVar66,auVar58,auVar15);
          auVar66 = vmovshdup_avx(auVar58);
          fVar197 = auVar66._0_4_ - auVar58._0_4_;
          vucomiss_avx512f(ZEXT416((uint)fVar197));
          if (uVar5 == 0 || bVar31) goto LAB_017dc0d0;
          auVar66 = vshufps_avx(auVar77,auVar77,0x50);
          vucomiss_avx512f(ZEXT416((uint)fVar197));
          auVar69 = vsubps_avx512vl(auVar138,auVar66);
          fVar186 = auVar66._0_4_;
          auVar150._0_4_ = fVar186 * fVar144;
          fVar195 = auVar66._4_4_;
          auVar150._4_4_ = fVar195 * fVar147;
          fVar196 = auVar66._8_4_;
          auVar150._8_4_ = fVar196 * fVar144;
          fVar208 = auVar66._12_4_;
          auVar150._12_4_ = fVar208 * fVar147;
          auVar156._0_4_ = fVar186 * fVar148;
          auVar156._4_4_ = fVar195 * fVar122;
          auVar156._8_4_ = fVar196 * fVar148;
          auVar156._12_4_ = fVar208 * fVar122;
          auVar160._0_4_ = fVar186 * fVar126;
          auVar160._4_4_ = fVar195 * fVar127;
          auVar160._8_4_ = fVar196 * fVar126;
          auVar160._12_4_ = fVar208 * fVar127;
          auVar139._0_4_ = fVar186 * fVar128;
          auVar139._4_4_ = fVar195 * fVar198;
          auVar139._8_4_ = fVar196 * fVar128;
          auVar139._12_4_ = fVar208 * fVar198;
          auVar66 = vfmadd231ps_fma(auVar150,auVar69,auVar44);
          auVar67 = vfmadd231ps_fma(auVar156,auVar69,auVar46);
          auVar68 = vfmadd231ps_fma(auVar160,auVar69,auVar47);
          auVar69 = vfmadd231ps_fma(auVar139,auVar69,auVar124);
          auVar92._16_16_ = auVar66;
          auVar92._0_16_ = auVar66;
          auVar93._16_16_ = auVar67;
          auVar93._0_16_ = auVar67;
          auVar95._16_16_ = auVar68;
          auVar95._0_16_ = auVar68;
          auVar99 = vpermps_avx512vl(auVar234._0_32_,ZEXT1632(auVar58));
          auVar101 = vsubps_avx(auVar93,auVar92);
          auVar67 = vfmadd213ps_fma(auVar101,auVar99,auVar92);
          auVar101 = vsubps_avx(auVar95,auVar93);
          auVar79 = vfmadd213ps_fma(auVar101,auVar99,auVar93);
          auVar66 = vsubps_avx(auVar69,auVar68);
          auVar94._16_16_ = auVar66;
          auVar94._0_16_ = auVar66;
          auVar66 = vfmadd213ps_fma(auVar94,auVar99,auVar95);
          auVar101 = vsubps_avx(ZEXT1632(auVar79),ZEXT1632(auVar67));
          auVar67 = vfmadd213ps_fma(auVar101,auVar99,ZEXT1632(auVar67));
          auVar101 = vsubps_avx(ZEXT1632(auVar66),ZEXT1632(auVar79));
          auVar66 = vfmadd213ps_fma(auVar101,auVar99,ZEXT1632(auVar79));
          auVar101 = vsubps_avx(ZEXT1632(auVar66),ZEXT1632(auVar67));
          auVar164 = vfmadd231ps_fma(ZEXT1632(auVar67),auVar101,auVar99);
          auVar101 = vmulps_avx512vl(auVar101,auVar232._0_32_);
          auVar91._16_16_ = auVar101._16_16_;
          auVar66 = vmulss_avx512f(ZEXT416((uint)fVar197),SUB6416(ZEXT464(0x3eaaaaab),0));
          fVar186 = auVar66._0_4_;
          auVar161._0_8_ =
               CONCAT44(auVar164._4_4_ + fVar186 * auVar101._4_4_,
                        auVar164._0_4_ + fVar186 * auVar101._0_4_);
          auVar161._8_4_ = auVar164._8_4_ + fVar186 * auVar101._8_4_;
          auVar161._12_4_ = auVar164._12_4_ + fVar186 * auVar101._12_4_;
          auVar151._0_4_ = fVar186 * auVar101._16_4_;
          auVar151._4_4_ = fVar186 * auVar101._20_4_;
          auVar151._8_4_ = fVar186 * auVar101._24_4_;
          auVar151._12_4_ = fVar186 * auVar101._28_4_;
          auVar76 = vsubps_avx((undefined1  [16])0x0,auVar151);
          auVar79 = vshufpd_avx(auVar164,auVar164,3);
          auVar82 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar66 = vsubps_avx(auVar79,auVar164);
          auVar67 = vsubps_avx(auVar82,(undefined1  [16])0x0);
          auVar169._0_4_ = auVar66._0_4_ + auVar67._0_4_;
          auVar169._4_4_ = auVar66._4_4_ + auVar67._4_4_;
          auVar169._8_4_ = auVar66._8_4_ + auVar67._8_4_;
          auVar169._12_4_ = auVar66._12_4_ + auVar67._12_4_;
          auVar66 = vshufps_avx(auVar164,auVar164,0xb1);
          auVar67 = vshufps_avx(auVar161,auVar161,0xb1);
          auVar68 = vshufps_avx(auVar76,auVar76,0xb1);
          auVar69 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar223._4_4_ = auVar169._0_4_;
          auVar223._0_4_ = auVar169._0_4_;
          auVar223._8_4_ = auVar169._0_4_;
          auVar223._12_4_ = auVar169._0_4_;
          auVar72 = vshufps_avx(auVar169,auVar169,0x55);
          fVar186 = auVar72._0_4_;
          auVar181._0_4_ = auVar66._0_4_ * fVar186;
          fVar195 = auVar72._4_4_;
          auVar181._4_4_ = auVar66._4_4_ * fVar195;
          fVar196 = auVar72._8_4_;
          auVar181._8_4_ = auVar66._8_4_ * fVar196;
          fVar208 = auVar72._12_4_;
          auVar181._12_4_ = auVar66._12_4_ * fVar208;
          auVar188._0_4_ = auVar67._0_4_ * fVar186;
          auVar188._4_4_ = auVar67._4_4_ * fVar195;
          auVar188._8_4_ = auVar67._8_4_ * fVar196;
          auVar188._12_4_ = auVar67._12_4_ * fVar208;
          auVar201._0_4_ = auVar68._0_4_ * fVar186;
          auVar201._4_4_ = auVar68._4_4_ * fVar195;
          auVar201._8_4_ = auVar68._8_4_ * fVar196;
          auVar201._12_4_ = auVar68._12_4_ * fVar208;
          auVar170._0_4_ = auVar69._0_4_ * fVar186;
          auVar170._4_4_ = auVar69._4_4_ * fVar195;
          auVar170._8_4_ = auVar69._8_4_ * fVar196;
          auVar170._12_4_ = auVar69._12_4_ * fVar208;
          auVar66 = vfmadd231ps_fma(auVar181,auVar223,auVar164);
          auVar67 = vfmadd231ps_fma(auVar188,auVar223,auVar161);
          auVar74 = vfmadd231ps_fma(auVar201,auVar223,auVar76);
          auVar75 = vfmadd231ps_fma(auVar170,(undefined1  [16])0x0,auVar223);
          auVar72 = vshufpd_avx(auVar66,auVar66,1);
          auVar73 = vshufpd_avx(auVar67,auVar67,1);
          auVar70 = vshufpd_avx512vl(auVar74,auVar74,1);
          auVar71 = vshufpd_avx512vl(auVar75,auVar75,1);
          auVar68 = vminss_avx(auVar66,auVar67);
          auVar66 = vmaxss_avx(auVar67,auVar66);
          auVar69 = vminss_avx(auVar74,auVar75);
          auVar67 = vmaxss_avx(auVar75,auVar74);
          auVar68 = vminss_avx(auVar68,auVar69);
          auVar66 = vmaxss_avx(auVar67,auVar66);
          auVar69 = vminss_avx(auVar72,auVar73);
          auVar67 = vmaxss_avx(auVar73,auVar72);
          auVar72 = vminss_avx512f(auVar70,auVar71);
          auVar73 = vmaxss_avx512f(auVar71,auVar70);
          auVar67 = vmaxss_avx(auVar73,auVar67);
          auVar69 = vminss_avx512f(auVar69,auVar72);
          vucomiss_avx512f(auVar68);
          fVar195 = auVar67._0_4_;
          fVar186 = auVar66._0_4_;
          if (4 < (uint)uVar24) {
            bVar32 = fVar195 == -0.0001;
            bVar29 = NAN(fVar195);
            if (fVar195 <= -0.0001) goto LAB_017dc7fc;
            break;
          }
LAB_017dc7fc:
          auVar72 = vucomiss_avx512f(auVar69);
          bVar32 = fVar195 <= -0.0001;
          bVar30 = -0.0001 < fVar186;
          bVar29 = bVar32;
          if (!bVar32) break;
          uVar12 = vcmpps_avx512vl(auVar68,auVar72,5);
          uVar13 = vcmpps_avx512vl(auVar69,auVar72,5);
          uVar23 = (uint)uVar12 & (uint)uVar13;
          bVar18 = (uVar23 & 1) == 0;
          bVar32 = bVar30 && bVar18;
          bVar29 = bVar30 && (uVar23 & 1) == 0;
        } while (!bVar30 || !bVar18);
        auVar74 = auVar237._0_16_;
        vcmpss_avx512f(auVar68,auVar74,1);
        uVar12 = vcmpss_avx512f(auVar66,auVar74,1);
        bVar30 = (bool)((byte)uVar12 & 1);
        auVar91._0_16_ = auVar238._0_16_;
        auVar105._4_28_ = auVar91._4_28_;
        auVar105._0_4_ = (float)((uint)bVar30 * -0x40800000 + (uint)!bVar30 * auVar238._0_4_);
        vucomiss_avx512f(auVar105._0_16_);
        bVar29 = (bool)(!bVar32 | bVar29);
        bVar30 = bVar29 == false;
        auVar107._16_16_ = auVar91._16_16_;
        auVar107._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar106._4_28_ = auVar107._4_28_;
        auVar106._0_4_ = (uint)bVar29 * auVar237._0_4_ + (uint)!bVar29 * 0x7f800000;
        auVar73 = auVar106._0_16_;
        auVar109._16_16_ = auVar91._16_16_;
        auVar109._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar108._4_28_ = auVar109._4_28_;
        auVar108._0_4_ = (uint)bVar29 * auVar237._0_4_ + (uint)!bVar29 * -0x800000;
        auVar72 = auVar108._0_16_;
        uVar12 = vcmpss_avx512f(auVar69,auVar74,1);
        bVar32 = (bool)((byte)uVar12 & 1);
        auVar111._16_16_ = auVar91._16_16_;
        auVar111._0_16_ = auVar238._0_16_;
        auVar110._4_28_ = auVar111._4_28_;
        auVar110._0_4_ = (float)((uint)bVar32 * -0x40800000 + (uint)!bVar32 * auVar238._0_4_);
        vucomiss_avx512f(auVar110._0_16_);
        if ((bVar29) || (bVar30)) {
          auVar69 = vucomiss_avx512f(auVar68);
          if ((bVar29) || (bVar30)) {
            auVar75 = vxorps_avx512vl(auVar68,auVar231._0_16_);
            auVar68 = vsubss_avx512f(auVar69,auVar68);
            auVar68 = vdivss_avx512f(auVar75,auVar68);
            auVar69 = vsubss_avx512f(ZEXT416(0x3f800000),auVar68);
            auVar69 = vfmadd213ss_avx512f(auVar69,auVar74,auVar68);
            auVar68 = auVar69;
          }
          else {
            auVar68 = vxorps_avx512vl(auVar69,auVar69);
            vucomiss_avx512f(auVar68);
            auVar69 = ZEXT416(0x3f800000);
            if ((bVar29) || (bVar30)) {
              auVar69 = SUB6416(ZEXT464(0xff800000),0);
              auVar68 = SUB6416(ZEXT464(0x7f800000),0);
            }
          }
          auVar73 = vminss_avx512f(auVar73,auVar68);
          auVar72 = vmaxss_avx(auVar69,auVar72);
        }
        auVar238 = ZEXT464(0x3f800000);
        uVar12 = vcmpss_avx512f(auVar67,auVar74,1);
        bVar32 = (bool)((byte)uVar12 & 1);
        auVar67 = auVar238._0_16_;
        fVar196 = (float)((uint)bVar32 * -0x40800000 + (uint)!bVar32 * 0x3f800000);
        if ((auVar105._0_4_ != fVar196) || (NAN(auVar105._0_4_) || NAN(fVar196))) {
          if ((fVar195 != fVar186) || (NAN(fVar195) || NAN(fVar186))) {
            auVar66 = vxorps_avx512vl(auVar66,auVar231._0_16_);
            auVar171._0_4_ = auVar66._0_4_ / (fVar195 - fVar186);
            auVar171._4_12_ = auVar66._4_12_;
            auVar66 = vsubss_avx512f(auVar67,auVar171);
            auVar66 = vfmadd213ss_avx512f(auVar66,auVar74,auVar171);
            auVar68 = auVar66;
          }
          else if ((fVar186 != 0.0) ||
                  (auVar66 = auVar67, auVar68 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar186))) {
            auVar66 = SUB6416(ZEXT464(0xff800000),0);
            auVar68 = SUB6416(ZEXT464(0x7f800000),0);
          }
          auVar73 = vminss_avx(auVar73,auVar68);
          auVar72 = vmaxss_avx(auVar66,auVar72);
        }
        bVar32 = auVar110._0_4_ != fVar196;
        auVar66 = vminss_avx512f(auVar73,auVar67);
        auVar113._16_16_ = auVar91._16_16_;
        auVar113._0_16_ = auVar73;
        auVar112._4_28_ = auVar113._4_28_;
        auVar112._0_4_ = (uint)bVar32 * auVar66._0_4_ + (uint)!bVar32 * auVar73._0_4_;
        auVar66 = vmaxss_avx512f(auVar67,auVar72);
        auVar115._16_16_ = auVar91._16_16_;
        auVar115._0_16_ = auVar72;
        auVar114._4_28_ = auVar115._4_28_;
        auVar114._0_4_ = (uint)bVar32 * auVar66._0_4_ + (uint)!bVar32 * auVar72._0_4_;
        auVar66 = vmaxss_avx512f(auVar74,auVar112._0_16_);
        auVar68 = vminss_avx512f(auVar114._0_16_,auVar67);
      } while (auVar68._0_4_ < auVar66._0_4_);
      auVar74 = vmaxss_avx512f(auVar74,ZEXT416((uint)(auVar66._0_4_ + -0.1)));
      auVar75 = vminss_avx512f(ZEXT416((uint)(auVar68._0_4_ + 0.1)),auVar67);
      auVar140._0_8_ = auVar164._0_8_;
      auVar140._8_8_ = auVar140._0_8_;
      auVar189._8_8_ = auVar161._0_8_;
      auVar189._0_8_ = auVar161._0_8_;
      auVar202._8_8_ = auVar76._0_8_;
      auVar202._0_8_ = auVar76._0_8_;
      auVar66 = vshufpd_avx(auVar161,auVar161,3);
      auVar68 = vshufpd_avx(auVar76,auVar76,3);
      auVar69 = vshufps_avx(auVar74,auVar75,0);
      auVar73 = vsubps_avx512vl(auVar138,auVar69);
      fVar186 = auVar69._0_4_;
      auVar157._0_4_ = fVar186 * auVar79._0_4_;
      fVar195 = auVar69._4_4_;
      auVar157._4_4_ = fVar195 * auVar79._4_4_;
      fVar196 = auVar69._8_4_;
      auVar157._8_4_ = fVar196 * auVar79._8_4_;
      fVar208 = auVar69._12_4_;
      auVar157._12_4_ = fVar208 * auVar79._12_4_;
      auVar162._0_4_ = fVar186 * auVar66._0_4_;
      auVar162._4_4_ = fVar195 * auVar66._4_4_;
      auVar162._8_4_ = fVar196 * auVar66._8_4_;
      auVar162._12_4_ = fVar208 * auVar66._12_4_;
      auVar225._0_4_ = auVar68._0_4_ * fVar186;
      auVar225._4_4_ = auVar68._4_4_ * fVar195;
      auVar225._8_4_ = auVar68._8_4_ * fVar196;
      auVar225._12_4_ = auVar68._12_4_ * fVar208;
      auVar152._0_4_ = fVar186 * auVar82._0_4_;
      auVar152._4_4_ = fVar195 * auVar82._4_4_;
      auVar152._8_4_ = fVar196 * auVar82._8_4_;
      auVar152._12_4_ = fVar208 * auVar82._12_4_;
      auVar79 = vfmadd231ps_fma(auVar157,auVar73,auVar140);
      auVar82 = vfmadd231ps_fma(auVar162,auVar73,auVar189);
      auVar72 = vfmadd231ps_fma(auVar225,auVar73,auVar202);
      auVar73 = vfmadd231ps_fma(auVar152,auVar73,ZEXT816(0));
      auVar68 = vsubss_avx512f(auVar67,auVar74);
      auVar66 = vmovshdup_avx(auVar77);
      auVar164 = vfmadd231ss_fma(ZEXT416((uint)(auVar66._0_4_ * auVar74._0_4_)),auVar77,auVar68);
      auVar68 = vsubss_avx512f(auVar67,auVar75);
      auVar70 = vfmadd231ss_fma(ZEXT416((uint)(auVar66._0_4_ * auVar75._0_4_)),auVar77,auVar68);
      auVar76 = vdivss_avx512f(auVar67,ZEXT416((uint)fVar197));
      auVar77 = vsubps_avx(auVar82,auVar79);
      auVar68 = vmulps_avx512vl(auVar77,auVar137);
      auVar77 = vsubps_avx(auVar72,auVar82);
      auVar69 = vmulps_avx512vl(auVar77,auVar137);
      auVar77 = vsubps_avx(auVar73,auVar72);
      auVar77 = vmulps_avx512vl(auVar77,auVar137);
      auVar66 = vminps_avx(auVar69,auVar77);
      auVar77 = vmaxps_avx(auVar69,auVar77);
      auVar66 = vminps_avx(auVar68,auVar66);
      auVar77 = vmaxps_avx(auVar68,auVar77);
      auVar68 = vshufpd_avx(auVar66,auVar66,3);
      auVar69 = vshufpd_avx(auVar77,auVar77,3);
      auVar66 = vminps_avx(auVar66,auVar68);
      auVar77 = vmaxps_avx(auVar77,auVar69);
      fVar197 = auVar76._0_4_;
      auVar172._0_4_ = auVar66._0_4_ * fVar197;
      auVar172._4_4_ = auVar66._4_4_ * fVar197;
      auVar172._8_4_ = auVar66._8_4_ * fVar197;
      auVar172._12_4_ = auVar66._12_4_ * fVar197;
      auVar165._0_4_ = fVar197 * auVar77._0_4_;
      auVar165._4_4_ = fVar197 * auVar77._4_4_;
      auVar165._8_4_ = fVar197 * auVar77._8_4_;
      auVar165._12_4_ = fVar197 * auVar77._12_4_;
      auVar76 = vdivss_avx512f(auVar67,ZEXT416((uint)(auVar70._0_4_ - auVar164._0_4_)));
      auVar77 = vshufpd_avx(auVar79,auVar79,3);
      auVar66 = vshufpd_avx(auVar82,auVar82,3);
      auVar68 = vshufpd_avx(auVar72,auVar72,3);
      auVar69 = vshufpd_avx(auVar73,auVar73,3);
      auVar77 = vsubps_avx(auVar77,auVar79);
      auVar79 = vsubps_avx(auVar66,auVar82);
      auVar82 = vsubps_avx(auVar68,auVar72);
      auVar69 = vsubps_avx(auVar69,auVar73);
      auVar66 = vminps_avx(auVar77,auVar79);
      auVar77 = vmaxps_avx(auVar77,auVar79);
      auVar68 = vminps_avx(auVar82,auVar69);
      auVar68 = vminps_avx(auVar66,auVar68);
      auVar66 = vmaxps_avx(auVar82,auVar69);
      auVar77 = vmaxps_avx(auVar77,auVar66);
      fVar197 = auVar76._0_4_;
      auVar203._0_4_ = fVar197 * auVar68._0_4_;
      auVar203._4_4_ = fVar197 * auVar68._4_4_;
      auVar203._8_4_ = fVar197 * auVar68._8_4_;
      auVar203._12_4_ = fVar197 * auVar68._12_4_;
      auVar190._0_4_ = fVar197 * auVar77._0_4_;
      auVar190._4_4_ = fVar197 * auVar77._4_4_;
      auVar190._8_4_ = fVar197 * auVar77._8_4_;
      auVar190._12_4_ = fVar197 * auVar77._12_4_;
      auVar69 = vinsertps_avx(auVar58,auVar164,0x10);
      auVar71 = vpermt2ps_avx512vl(auVar58,_DAT_01fb9f90,auVar70);
      auVar125._0_4_ = auVar69._0_4_ + auVar71._0_4_;
      auVar125._4_4_ = auVar69._4_4_ + auVar71._4_4_;
      auVar125._8_4_ = auVar69._8_4_ + auVar71._8_4_;
      auVar125._12_4_ = auVar69._12_4_ + auVar71._12_4_;
      auVar16._8_4_ = 0x3f000000;
      auVar16._0_8_ = 0x3f0000003f000000;
      auVar16._12_4_ = 0x3f000000;
      auVar76 = vmulps_avx512vl(auVar125,auVar16);
      auVar66 = vshufps_avx(auVar76,auVar76,0x54);
      uVar123 = auVar76._0_4_;
      auVar131._4_4_ = uVar123;
      auVar131._0_4_ = uVar123;
      auVar131._8_4_ = uVar123;
      auVar131._12_4_ = uVar123;
      auVar68 = vfmadd213ps_fma(auVar38,auVar131,auVar10);
      auVar79 = vfmadd213ps_fma(auVar59,auVar131,auVar35);
      auVar82 = vfmadd213ps_fma(auVar60,auVar131,auVar42);
      auVar77 = vsubps_avx(auVar79,auVar68);
      auVar68 = vfmadd213ps_fma(auVar77,auVar131,auVar68);
      auVar77 = vsubps_avx(auVar82,auVar79);
      auVar77 = vfmadd213ps_fma(auVar77,auVar131,auVar79);
      auVar77 = vsubps_avx(auVar77,auVar68);
      auVar68 = vfmadd231ps_fma(auVar68,auVar77,auVar131);
      auVar72 = vmulps_avx512vl(auVar77,auVar137);
      auVar214._8_8_ = auVar68._0_8_;
      auVar214._0_8_ = auVar68._0_8_;
      auVar77 = vshufpd_avx(auVar68,auVar68,3);
      auVar68 = vshufps_avx(auVar76,auVar76,0x55);
      auVar79 = vsubps_avx(auVar77,auVar214);
      auVar82 = vfmadd231ps_fma(auVar214,auVar68,auVar79);
      auVar226._8_8_ = auVar72._0_8_;
      auVar226._0_8_ = auVar72._0_8_;
      auVar77 = vshufpd_avx(auVar72,auVar72,3);
      auVar77 = vsubps_avx512vl(auVar77,auVar226);
      auVar77 = vfmadd213ps_avx512vl(auVar77,auVar68,auVar226);
      auVar132._0_8_ = auVar79._0_8_ ^ 0x8000000080000000;
      auVar132._8_4_ = auVar79._8_4_ ^ 0x80000000;
      auVar132._12_4_ = auVar79._12_4_ ^ 0x80000000;
      auVar68 = vmovshdup_avx512vl(auVar77);
      auVar227._0_8_ = auVar68._0_8_ ^ 0x8000000080000000;
      auVar227._8_4_ = auVar68._8_4_ ^ 0x80000000;
      auVar227._12_4_ = auVar68._12_4_ ^ 0x80000000;
      auVar72 = vmovshdup_avx512vl(auVar79);
      auVar73 = vpermt2ps_avx512vl(auVar227,ZEXT416(5),auVar79);
      auVar78 = vxorps_avx512vl(ZEXT416(5),ZEXT416(5));
      auVar237 = ZEXT1664(auVar78);
      auVar68 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar68._0_4_ * auVar79._0_4_)),auVar77,auVar72);
      auVar79 = vpermt2ps_avx512vl(auVar77,SUB6416(ZEXT464(4),0),auVar132);
      auVar153._0_4_ = auVar68._0_4_;
      auVar153._4_4_ = auVar153._0_4_;
      auVar153._8_4_ = auVar153._0_4_;
      auVar153._12_4_ = auVar153._0_4_;
      auVar77 = vdivps_avx(auVar73,auVar153);
      auVar80 = vdivps_avx512vl(auVar79,auVar153);
      fVar197 = auVar82._0_4_;
      auVar68 = vshufps_avx(auVar82,auVar82,0x55);
      auVar215._0_4_ = fVar197 * auVar77._0_4_ + auVar68._0_4_ * auVar80._0_4_;
      auVar215._4_4_ = fVar197 * auVar77._4_4_ + auVar68._4_4_ * auVar80._4_4_;
      auVar215._8_4_ = fVar197 * auVar77._8_4_ + auVar68._8_4_ * auVar80._8_4_;
      auVar215._12_4_ = fVar197 * auVar77._12_4_ + auVar68._12_4_ * auVar80._12_4_;
      auVar74 = vsubps_avx(auVar66,auVar215);
      auVar68 = vmovshdup_avx(auVar77);
      auVar66 = vinsertps_avx(auVar172,auVar203,0x1c);
      auVar228._0_4_ = auVar68._0_4_ * auVar66._0_4_;
      auVar228._4_4_ = auVar68._4_4_ * auVar66._4_4_;
      auVar228._8_4_ = auVar68._8_4_ * auVar66._8_4_;
      auVar228._12_4_ = auVar68._12_4_ * auVar66._12_4_;
      auVar75 = vinsertps_avx512f(auVar165,auVar190,0x1c);
      auVar68 = vmulps_avx512vl(auVar68,auVar75);
      auVar73 = vminps_avx512vl(auVar228,auVar68);
      auVar82 = vmaxps_avx(auVar68,auVar228);
      auVar72 = vmovshdup_avx(auVar80);
      auVar68 = vinsertps_avx(auVar203,auVar172,0x4c);
      auVar204._0_4_ = auVar72._0_4_ * auVar68._0_4_;
      auVar204._4_4_ = auVar72._4_4_ * auVar68._4_4_;
      auVar204._8_4_ = auVar72._8_4_ * auVar68._8_4_;
      auVar204._12_4_ = auVar72._12_4_ * auVar68._12_4_;
      auVar79 = vinsertps_avx(auVar190,auVar165,0x4c);
      auVar191._0_4_ = auVar72._0_4_ * auVar79._0_4_;
      auVar191._4_4_ = auVar72._4_4_ * auVar79._4_4_;
      auVar191._8_4_ = auVar72._8_4_ * auVar79._8_4_;
      auVar191._12_4_ = auVar72._12_4_ * auVar79._12_4_;
      auVar72 = vminps_avx(auVar204,auVar191);
      auVar73 = vaddps_avx512vl(auVar73,auVar72);
      auVar72 = vmaxps_avx(auVar191,auVar204);
      auVar192._0_4_ = auVar82._0_4_ + auVar72._0_4_;
      auVar192._4_4_ = auVar82._4_4_ + auVar72._4_4_;
      auVar192._8_4_ = auVar82._8_4_ + auVar72._8_4_;
      auVar192._12_4_ = auVar82._12_4_ + auVar72._12_4_;
      auVar205._8_8_ = 0x3f80000000000000;
      auVar205._0_8_ = 0x3f80000000000000;
      auVar82 = vsubps_avx(auVar205,auVar192);
      auVar72 = vsubps_avx(auVar205,auVar73);
      auVar73 = vsubps_avx(auVar69,auVar76);
      auVar76 = vsubps_avx(auVar71,auVar76);
      fVar208 = auVar73._0_4_;
      auVar229._0_4_ = fVar208 * auVar82._0_4_;
      fVar209 = auVar73._4_4_;
      auVar229._4_4_ = fVar209 * auVar82._4_4_;
      fVar210 = auVar73._8_4_;
      auVar229._8_4_ = fVar210 * auVar82._8_4_;
      fVar211 = auVar73._12_4_;
      auVar229._12_4_ = fVar211 * auVar82._12_4_;
      auVar81 = vbroadcastss_avx512vl(auVar77);
      auVar66 = vmulps_avx512vl(auVar81,auVar66);
      auVar75 = vmulps_avx512vl(auVar81,auVar75);
      auVar81 = vminps_avx512vl(auVar66,auVar75);
      auVar75 = vmaxps_avx512vl(auVar75,auVar66);
      auVar66 = vbroadcastss_avx512vl(auVar80);
      auVar68 = vmulps_avx512vl(auVar66,auVar68);
      auVar66 = vmulps_avx512vl(auVar66,auVar79);
      auVar79 = vminps_avx512vl(auVar68,auVar66);
      auVar79 = vaddps_avx512vl(auVar81,auVar79);
      auVar73 = vmulps_avx512vl(auVar73,auVar72);
      fVar197 = auVar76._0_4_;
      auVar193._0_4_ = fVar197 * auVar82._0_4_;
      fVar186 = auVar76._4_4_;
      auVar193._4_4_ = fVar186 * auVar82._4_4_;
      fVar195 = auVar76._8_4_;
      auVar193._8_4_ = fVar195 * auVar82._8_4_;
      fVar196 = auVar76._12_4_;
      auVar193._12_4_ = fVar196 * auVar82._12_4_;
      auVar206._0_4_ = fVar197 * auVar72._0_4_;
      auVar206._4_4_ = fVar186 * auVar72._4_4_;
      auVar206._8_4_ = fVar195 * auVar72._8_4_;
      auVar206._12_4_ = fVar196 * auVar72._12_4_;
      auVar66 = vmaxps_avx(auVar66,auVar68);
      auVar166._0_4_ = auVar75._0_4_ + auVar66._0_4_;
      auVar166._4_4_ = auVar75._4_4_ + auVar66._4_4_;
      auVar166._8_4_ = auVar75._8_4_ + auVar66._8_4_;
      auVar166._12_4_ = auVar75._12_4_ + auVar66._12_4_;
      auVar173._8_8_ = 0x3f800000;
      auVar173._0_8_ = 0x3f800000;
      auVar66 = vsubps_avx(auVar173,auVar166);
      auVar68 = vsubps_avx512vl(auVar173,auVar79);
      auVar224._0_4_ = fVar208 * auVar66._0_4_;
      auVar224._4_4_ = fVar209 * auVar66._4_4_;
      auVar224._8_4_ = fVar210 * auVar66._8_4_;
      auVar224._12_4_ = fVar211 * auVar66._12_4_;
      auVar216._0_4_ = fVar208 * auVar68._0_4_;
      auVar216._4_4_ = fVar209 * auVar68._4_4_;
      auVar216._8_4_ = fVar210 * auVar68._8_4_;
      auVar216._12_4_ = fVar211 * auVar68._12_4_;
      auVar167._0_4_ = fVar197 * auVar66._0_4_;
      auVar167._4_4_ = fVar186 * auVar66._4_4_;
      auVar167._8_4_ = fVar195 * auVar66._8_4_;
      auVar167._12_4_ = fVar196 * auVar66._12_4_;
      auVar174._0_4_ = fVar197 * auVar68._0_4_;
      auVar174._4_4_ = fVar186 * auVar68._4_4_;
      auVar174._8_4_ = fVar195 * auVar68._8_4_;
      auVar174._12_4_ = fVar196 * auVar68._12_4_;
      auVar66 = vminps_avx(auVar224,auVar216);
      auVar68 = vminps_avx512vl(auVar167,auVar174);
      auVar79 = vminps_avx512vl(auVar66,auVar68);
      auVar66 = vmaxps_avx(auVar216,auVar224);
      auVar68 = vmaxps_avx(auVar174,auVar167);
      auVar68 = vmaxps_avx(auVar68,auVar66);
      auVar82 = vminps_avx512vl(auVar229,auVar73);
      auVar66 = vminps_avx(auVar193,auVar206);
      auVar66 = vminps_avx(auVar82,auVar66);
      auVar66 = vhaddps_avx(auVar79,auVar66);
      auVar82 = vmaxps_avx512vl(auVar73,auVar229);
      auVar79 = vmaxps_avx(auVar206,auVar193);
      auVar79 = vmaxps_avx(auVar79,auVar82);
      auVar68 = vhaddps_avx(auVar68,auVar79);
      auVar66 = vshufps_avx(auVar66,auVar66,0xe8);
      auVar68 = vshufps_avx(auVar68,auVar68,0xe8);
      auVar168._0_4_ = auVar66._0_4_ + auVar74._0_4_;
      auVar168._4_4_ = auVar66._4_4_ + auVar74._4_4_;
      auVar168._8_4_ = auVar66._8_4_ + auVar74._8_4_;
      auVar168._12_4_ = auVar66._12_4_ + auVar74._12_4_;
      auVar175._0_4_ = auVar68._0_4_ + auVar74._0_4_;
      auVar175._4_4_ = auVar68._4_4_ + auVar74._4_4_;
      auVar175._8_4_ = auVar68._8_4_ + auVar74._8_4_;
      auVar175._12_4_ = auVar68._12_4_ + auVar74._12_4_;
      auVar66 = vmaxps_avx(auVar69,auVar168);
      auVar68 = vminps_avx(auVar175,auVar71);
      uVar33 = vcmpps_avx512vl(auVar68,auVar66,1);
    } while ((uVar33 & 3) != 0);
    uVar33 = vcmpps_avx512vl(auVar175,auVar71,1);
    uVar12 = vcmpps_avx512vl(auVar58,auVar168,1);
    if (((ushort)uVar12 & (ushort)uVar33 & 1) == 0) {
      bVar22 = 0;
    }
    else {
      auVar66 = vmovshdup_avx(auVar168);
      bVar22 = auVar164._0_4_ < auVar66._0_4_ & (byte)(uVar33 >> 1) & 0x7f;
    }
    p03.field_0.i[0] = auVar43._0_4_;
    p03.field_0.i[1] = auVar43._4_4_;
    p03.field_0.i[2] = auVar43._8_4_;
    p03.field_0.i[3] = auVar43._12_4_;
    if (((3 < (uint)uVar24 || uVar5 != 0 && !bVar31) | bVar22) == 1) {
      lVar25 = 0xc9;
      do {
        lVar25 = lVar25 + -1;
        if (lVar25 == 0) goto LAB_017dc5d9;
        auVar58 = vsubss_avx512f(auVar67,auVar74);
        fVar195 = auVar58._0_4_;
        fVar197 = fVar195 * fVar195 * fVar195;
        fVar196 = auVar74._0_4_;
        fVar186 = fVar196 * 3.0 * fVar195 * fVar195;
        fVar195 = fVar195 * fVar196 * fVar196 * 3.0;
        auVar146._4_4_ = fVar197;
        auVar146._0_4_ = fVar197;
        auVar146._8_4_ = fVar197;
        auVar146._12_4_ = fVar197;
        auVar141._4_4_ = fVar186;
        auVar141._0_4_ = fVar186;
        auVar141._8_4_ = fVar186;
        auVar141._12_4_ = fVar186;
        auVar118._4_4_ = fVar195;
        auVar118._0_4_ = fVar195;
        auVar118._8_4_ = fVar195;
        auVar118._12_4_ = fVar195;
        fVar196 = fVar196 * fVar196 * fVar196;
        auVar158._0_4_ = p03.field_0.v[0] * fVar196;
        auVar158._4_4_ = p03.field_0.v[1] * fVar196;
        auVar158._8_4_ = p03.field_0.v[2] * fVar196;
        auVar158._12_4_ = p03.field_0.v[3] * fVar196;
        auVar58 = vfmadd231ps_fma(auVar158,auVar42,auVar118);
        auVar58 = vfmadd231ps_fma(auVar58,auVar35,auVar141);
        auVar58 = vfmadd231ps_fma(auVar58,auVar10,auVar146);
        auVar119._8_8_ = auVar58._0_8_;
        auVar119._0_8_ = auVar58._0_8_;
        auVar58 = vshufpd_avx(auVar58,auVar58,3);
        auVar66 = vshufps_avx(auVar74,auVar74,0x55);
        auVar58 = vsubps_avx(auVar58,auVar119);
        auVar66 = vfmadd213ps_fma(auVar58,auVar66,auVar119);
        fVar197 = auVar66._0_4_;
        auVar58 = vshufps_avx(auVar66,auVar66,0x55);
        auVar120._0_4_ = auVar77._0_4_ * fVar197 + auVar80._0_4_ * auVar58._0_4_;
        auVar120._4_4_ = auVar77._4_4_ * fVar197 + auVar80._4_4_ * auVar58._4_4_;
        auVar120._8_4_ = auVar77._8_4_ * fVar197 + auVar80._8_4_ * auVar58._8_4_;
        auVar120._12_4_ = auVar77._12_4_ * fVar197 + auVar80._12_4_ * auVar58._12_4_;
        auVar74 = vsubps_avx(auVar74,auVar120);
        auVar58 = vandps_avx512vl(auVar66,auVar235._0_16_);
        auVar66 = vprolq_avx512vl(auVar58,0x20);
        auVar58 = vmaxss_avx(auVar66,auVar58);
        bVar31 = auVar58._0_4_ <= fVar121;
      } while (fVar121 <= auVar58._0_4_);
      auVar58 = vucomiss_avx512f(auVar78);
      if (bVar31) {
        auVar77 = vucomiss_avx512f(auVar58);
        auVar238 = ZEXT1664(auVar77);
        if (bVar31) {
          vmovshdup_avx(auVar58);
          auVar77 = vucomiss_avx512f(auVar78);
          if (bVar31) {
            auVar66 = vucomiss_avx512f(auVar77);
            auVar238 = ZEXT1664(auVar66);
            if (bVar31) {
              auVar67 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                      ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
              auVar76 = vinsertps_avx(auVar67,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),
                                      0x28);
              auVar67 = vdpps_avx(auVar76,auVar11,0x7f);
              auVar68 = vdpps_avx(auVar76,auVar53,0x7f);
              auVar69 = vdpps_avx(auVar76,auVar54,0x7f);
              auVar79 = vdpps_avx(auVar76,auVar41,0x7f);
              auVar82 = vdpps_avx(auVar76,auVar40,0x7f);
              auVar72 = vdpps_avx(auVar76,auVar55,0x7f);
              auVar73 = vdpps_avx(auVar76,auVar56,0x7f);
              auVar76 = vdpps_avx(auVar76,auVar57,0x7f);
              auVar74 = vsubss_avx512f(auVar66,auVar77);
              fVar196 = auVar77._0_4_;
              auVar77 = vfmadd231ss_fma(ZEXT416((uint)(fVar196 * auVar82._0_4_)),auVar74,auVar67);
              auVar67 = vfmadd231ss_fma(ZEXT416((uint)(auVar72._0_4_ * fVar196)),auVar74,auVar68);
              auVar68 = vfmadd231ss_fma(ZEXT416((uint)(auVar73._0_4_ * fVar196)),auVar74,auVar69);
              auVar69 = vfmadd231ss_fma(ZEXT416((uint)(fVar196 * auVar76._0_4_)),auVar74,auVar79);
              auVar66 = vsubss_avx512f(auVar66,auVar58);
              auVar176._0_4_ = auVar66._0_4_;
              fVar197 = auVar176._0_4_ * auVar176._0_4_ * auVar176._0_4_;
              local_d8 = auVar58._0_4_;
              fVar186 = local_d8 * 3.0 * auVar176._0_4_ * auVar176._0_4_;
              fVar195 = auVar176._0_4_ * local_d8 * local_d8 * 3.0;
              fVar209 = local_d8 * local_d8 * local_d8;
              auVar66 = vfmadd231ss_fma(ZEXT416((uint)(fVar209 * auVar69._0_4_)),
                                        ZEXT416((uint)fVar195),auVar68);
              auVar66 = vfmadd231ss_fma(auVar66,ZEXT416((uint)fVar186),auVar67);
              auVar77 = vfmadd231ss_fma(auVar66,ZEXT416((uint)fVar197),auVar77);
              fVar208 = auVar77._0_4_;
              if ((fVar116 <= fVar208) &&
                 (fVar210 = *(float *)(ray + k * 4 + 0x80), fVar208 <= fVar210)) {
                local_c8 = vshufps_avx(auVar58,auVar58,0x55);
                auVar66 = vsubps_avx512vl(auVar138,local_c8);
                fVar211 = local_c8._0_4_;
                auVar182._0_4_ = fVar211 * auVar213._0_4_;
                fVar219 = local_c8._4_4_;
                auVar182._4_4_ = fVar219 * auVar213._4_4_;
                fVar220 = local_c8._8_4_;
                auVar182._8_4_ = fVar220 * auVar213._8_4_;
                fVar221 = local_c8._12_4_;
                auVar182._12_4_ = fVar221 * auVar213._12_4_;
                local_278 = auVar51._0_4_;
                fStack_274 = auVar51._4_4_;
                fStack_270 = auVar51._8_4_;
                fStack_26c = auVar51._12_4_;
                auVar194._0_4_ = fVar211 * local_278;
                auVar194._4_4_ = fVar219 * fStack_274;
                auVar194._8_4_ = fVar220 * fStack_270;
                auVar194._12_4_ = fVar221 * fStack_26c;
                local_288 = auVar52._0_4_;
                fStack_284 = auVar52._4_4_;
                fStack_280 = auVar52._8_4_;
                fStack_27c = auVar52._12_4_;
                auVar207._0_4_ = fVar211 * local_288;
                auVar207._4_4_ = fVar219 * fStack_284;
                auVar207._8_4_ = fVar220 * fStack_280;
                auVar207._12_4_ = fVar221 * fStack_27c;
                local_248 = auVar48._0_4_;
                fStack_244 = auVar48._4_4_;
                fStack_240 = auVar48._8_4_;
                fStack_23c = auVar48._12_4_;
                auVar217._0_4_ = fVar211 * local_248;
                auVar217._4_4_ = fVar219 * fStack_244;
                auVar217._8_4_ = fVar220 * fStack_240;
                auVar217._12_4_ = fVar221 * fStack_23c;
                auVar58 = vfmadd231ps_fma(auVar182,auVar66,auVar45);
                auVar77 = vfmadd231ps_fma(auVar194,auVar66,auVar49);
                auVar138 = vfmadd231ps_fma(auVar207,auVar66,auVar50);
                auVar66 = vfmadd231ps_fma(auVar217,auVar66,auVar36);
                auVar58 = vsubps_avx(auVar77,auVar58);
                auVar77 = vsubps_avx(auVar138,auVar77);
                auVar138 = vsubps_avx(auVar66,auVar138);
                auVar218._0_4_ = local_d8 * auVar77._0_4_;
                auVar218._4_4_ = local_d8 * auVar77._4_4_;
                auVar218._8_4_ = local_d8 * auVar77._8_4_;
                auVar218._12_4_ = local_d8 * auVar77._12_4_;
                auVar176._4_4_ = auVar176._0_4_;
                auVar176._8_4_ = auVar176._0_4_;
                auVar176._12_4_ = auVar176._0_4_;
                auVar58 = vfmadd231ps_fma(auVar218,auVar176,auVar58);
                auVar183._0_4_ = local_d8 * auVar138._0_4_;
                auVar183._4_4_ = local_d8 * auVar138._4_4_;
                auVar183._8_4_ = local_d8 * auVar138._8_4_;
                auVar183._12_4_ = local_d8 * auVar138._12_4_;
                auVar77 = vfmadd231ps_fma(auVar183,auVar176,auVar77);
                auVar184._0_4_ = local_d8 * auVar77._0_4_;
                auVar184._4_4_ = local_d8 * auVar77._4_4_;
                auVar184._8_4_ = local_d8 * auVar77._8_4_;
                auVar184._12_4_ = local_d8 * auVar77._12_4_;
                auVar58 = vfmadd231ps_fma(auVar184,auVar176,auVar58);
                auVar58 = vmulps_avx512vl(auVar58,auVar137);
                pGVar6 = (context->scene->geometries).items[uVar4].ptr;
                if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  local_2c8 = auVar63._0_4_;
                  fStack_2c4 = auVar63._4_4_;
                  fStack_2c0 = auVar63._8_4_;
                  fStack_2bc = auVar63._12_4_;
                  auVar163._0_4_ = fVar209 * local_2c8;
                  auVar163._4_4_ = fVar209 * fStack_2c4;
                  auVar163._8_4_ = fVar209 * fStack_2c0;
                  auVar163._12_4_ = fVar209 * fStack_2bc;
                  auVar159._4_4_ = fVar195;
                  auVar159._0_4_ = fVar195;
                  auVar159._8_4_ = fVar195;
                  auVar159._12_4_ = fVar195;
                  auVar77 = vfmadd132ps_fma(auVar159,auVar163,auVar62);
                  auVar154._4_4_ = fVar186;
                  auVar154._0_4_ = fVar186;
                  auVar154._8_4_ = fVar186;
                  auVar154._12_4_ = fVar186;
                  auVar77 = vfmadd132ps_fma(auVar154,auVar77,auVar61);
                  auVar142._4_4_ = fVar197;
                  auVar142._0_4_ = fVar197;
                  auVar142._8_4_ = fVar197;
                  auVar142._12_4_ = fVar197;
                  auVar138 = vfmadd132ps_fma(auVar142,auVar77,auVar34);
                  auVar77 = vshufps_avx(auVar138,auVar138,0xc9);
                  auVar137 = vshufps_avx(auVar58,auVar58,0xc9);
                  auVar143._0_4_ = auVar138._0_4_ * auVar137._0_4_;
                  auVar143._4_4_ = auVar138._4_4_ * auVar137._4_4_;
                  auVar143._8_4_ = auVar138._8_4_ * auVar137._8_4_;
                  auVar143._12_4_ = auVar138._12_4_ * auVar137._12_4_;
                  auVar58 = vfmsub231ps_fma(auVar143,auVar58,auVar77);
                  local_e8 = auVar58._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x80) = fVar208;
                    uVar123 = vextractps_avx(auVar58,1);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = uVar123;
                    uVar123 = vextractps_avx(auVar58,2);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar123;
                    *(undefined4 *)(ray + k * 4 + 0xe0) = local_e8;
                    *(float *)(ray + k * 4 + 0xf0) = local_d8;
                    *(float *)(ray + k * 4 + 0x100) = fVar196;
                    *(int *)(ray + k * 4 + 0x110) = (int)local_358;
                    *(uint *)(ray + k * 4 + 0x120) = uVar4;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    goto LAB_017dc5d9;
                  }
                  auVar77 = vshufps_avx(auVar58,auVar58,0x55);
                  local_f8 = vshufps_avx(auVar58,auVar58,0xaa);
                  local_108[0] = (RTCHitN)auVar77[0];
                  local_108[1] = (RTCHitN)auVar77[1];
                  local_108[2] = (RTCHitN)auVar77[2];
                  local_108[3] = (RTCHitN)auVar77[3];
                  local_108[4] = (RTCHitN)auVar77[4];
                  local_108[5] = (RTCHitN)auVar77[5];
                  local_108[6] = (RTCHitN)auVar77[6];
                  local_108[7] = (RTCHitN)auVar77[7];
                  local_108[8] = (RTCHitN)auVar77[8];
                  local_108[9] = (RTCHitN)auVar77[9];
                  local_108[10] = (RTCHitN)auVar77[10];
                  local_108[0xb] = (RTCHitN)auVar77[0xb];
                  local_108[0xc] = (RTCHitN)auVar77[0xc];
                  local_108[0xd] = (RTCHitN)auVar77[0xd];
                  local_108[0xe] = (RTCHitN)auVar77[0xe];
                  local_108[0xf] = (RTCHitN)auVar77[0xf];
                  uStack_e4 = local_e8;
                  uStack_e0 = local_e8;
                  uStack_dc = local_e8;
                  fStack_d4 = local_d8;
                  fStack_d0 = local_d8;
                  fStack_cc = local_d8;
                  local_2f8 = auVar65._0_8_;
                  uStack_2f0 = auVar65._8_8_;
                  local_b8 = local_2f8;
                  uStack_b0 = uStack_2f0;
                  local_a8 = auVar64;
                  vpcmpeqd_avx2(ZEXT1632(auVar64),ZEXT1632(auVar64));
                  uStack_94 = context->user->instID[0];
                  local_98 = uStack_94;
                  uStack_90 = uStack_94;
                  uStack_8c = uStack_94;
                  uStack_88 = context->user->instPrimID[0];
                  uStack_84 = uStack_88;
                  uStack_80 = uStack_88;
                  uStack_7c = uStack_88;
                  *(float *)(ray + k * 4 + 0x80) = fVar208;
                  args.valid = (int *)local_378;
                  args.geometryUserPtr = pGVar6->userPtr;
                  args.context = context->user;
                  args.hit = local_108;
                  args.N = 4;
                  local_378 = auVar37;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar6->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    local_360 = context;
                    (*pGVar6->intersectionFilterN)(&args);
                    auVar58 = vxorps_avx512vl(auVar78,auVar78);
                    auVar237 = ZEXT1664(auVar58);
                    auVar238 = ZEXT464(0x3f800000);
                    auVar234 = ZEXT3264(_DAT_01fb9fe0);
                    auVar58 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                    auVar233 = ZEXT1664(auVar58);
                    auVar101 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                    auVar232 = ZEXT3264(auVar101);
                    auVar58 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                    auVar231 = ZEXT1664(auVar58);
                    auVar58 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                    auVar230 = ZEXT1664(auVar58);
                    auVar58 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar236 = ZEXT1664(auVar58);
                    auVar58 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    auVar235 = ZEXT1664(auVar58);
                    context = local_360;
                  }
                  auVar58 = auVar237._0_16_;
                  uVar33 = vptestmd_avx512vl(local_378,local_378);
                  if ((uVar33 & 0xf) != 0) {
                    p_Var9 = context->args->filter;
                    if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var9)(&args);
                      auVar58 = vxorps_avx512vl(auVar58,auVar58);
                      auVar237 = ZEXT1664(auVar58);
                      auVar238 = ZEXT464(0x3f800000);
                      auVar234 = ZEXT3264(_DAT_01fb9fe0);
                      auVar58 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                      auVar233 = ZEXT1664(auVar58);
                      auVar101 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      auVar232 = ZEXT3264(auVar101);
                      auVar58 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                      auVar231 = ZEXT1664(auVar58);
                      auVar58 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      auVar230 = ZEXT1664(auVar58);
                      auVar58 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar236 = ZEXT1664(auVar58);
                      auVar58 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar235 = ZEXT1664(auVar58);
                    }
                    uVar33 = vptestmd_avx512vl(local_378,local_378);
                    uVar33 = uVar33 & 0xf;
                    bVar22 = (byte)uVar33;
                    if (bVar22 != 0) {
                      iVar19 = *(int *)(args.hit + 4);
                      iVar20 = *(int *)(args.hit + 8);
                      iVar21 = *(int *)(args.hit + 0xc);
                      bVar31 = (bool)((byte)(uVar33 >> 1) & 1);
                      bVar32 = (bool)((byte)(uVar33 >> 2) & 1);
                      bVar29 = SUB81(uVar33 >> 3,0);
                      *(uint *)(args.ray + 0xc0) =
                           (uint)(bVar22 & 1) * *(int *)args.hit |
                           (uint)!(bool)(bVar22 & 1) * *(uint *)(args.ray + 0xc0);
                      *(uint *)(args.ray + 0xc4) =
                           (uint)bVar31 * iVar19 | (uint)!bVar31 * *(int *)(args.ray + 0xc4);
                      *(uint *)(args.ray + 200) =
                           (uint)bVar32 * iVar20 | (uint)!bVar32 * *(int *)(args.ray + 200);
                      *(uint *)(args.ray + 0xcc) =
                           (uint)bVar29 * iVar21 | (uint)!bVar29 * *(int *)(args.ray + 0xcc);
                      iVar19 = *(int *)(args.hit + 0x14);
                      iVar20 = *(int *)(args.hit + 0x18);
                      iVar21 = *(int *)(args.hit + 0x1c);
                      bVar31 = (bool)((byte)(uVar33 >> 1) & 1);
                      bVar32 = (bool)((byte)(uVar33 >> 2) & 1);
                      bVar29 = SUB81(uVar33 >> 3,0);
                      *(uint *)(args.ray + 0xd0) =
                           (uint)(bVar22 & 1) * *(int *)(args.hit + 0x10) |
                           (uint)!(bool)(bVar22 & 1) * *(uint *)(args.ray + 0xd0);
                      *(uint *)(args.ray + 0xd4) =
                           (uint)bVar31 * iVar19 | (uint)!bVar31 * *(int *)(args.ray + 0xd4);
                      *(uint *)(args.ray + 0xd8) =
                           (uint)bVar32 * iVar20 | (uint)!bVar32 * *(int *)(args.ray + 0xd8);
                      *(uint *)(args.ray + 0xdc) =
                           (uint)bVar29 * iVar21 | (uint)!bVar29 * *(int *)(args.ray + 0xdc);
                      iVar19 = *(int *)(args.hit + 0x24);
                      iVar20 = *(int *)(args.hit + 0x28);
                      iVar21 = *(int *)(args.hit + 0x2c);
                      bVar31 = (bool)((byte)(uVar33 >> 1) & 1);
                      bVar32 = (bool)((byte)(uVar33 >> 2) & 1);
                      bVar29 = SUB81(uVar33 >> 3,0);
                      *(uint *)(args.ray + 0xe0) =
                           (uint)(bVar22 & 1) * *(int *)(args.hit + 0x20) |
                           (uint)!(bool)(bVar22 & 1) * *(uint *)(args.ray + 0xe0);
                      *(uint *)(args.ray + 0xe4) =
                           (uint)bVar31 * iVar19 | (uint)!bVar31 * *(int *)(args.ray + 0xe4);
                      *(uint *)(args.ray + 0xe8) =
                           (uint)bVar32 * iVar20 | (uint)!bVar32 * *(int *)(args.ray + 0xe8);
                      *(uint *)(args.ray + 0xec) =
                           (uint)bVar29 * iVar21 | (uint)!bVar29 * *(int *)(args.ray + 0xec);
                      iVar19 = *(int *)(args.hit + 0x34);
                      iVar20 = *(int *)(args.hit + 0x38);
                      iVar21 = *(int *)(args.hit + 0x3c);
                      bVar31 = (bool)((byte)(uVar33 >> 1) & 1);
                      bVar32 = (bool)((byte)(uVar33 >> 2) & 1);
                      bVar29 = SUB81(uVar33 >> 3,0);
                      *(uint *)(args.ray + 0xf0) =
                           (uint)(bVar22 & 1) * *(int *)(args.hit + 0x30) |
                           (uint)!(bool)(bVar22 & 1) * *(uint *)(args.ray + 0xf0);
                      *(uint *)(args.ray + 0xf4) =
                           (uint)bVar31 * iVar19 | (uint)!bVar31 * *(int *)(args.ray + 0xf4);
                      *(uint *)(args.ray + 0xf8) =
                           (uint)bVar32 * iVar20 | (uint)!bVar32 * *(int *)(args.ray + 0xf8);
                      *(uint *)(args.ray + 0xfc) =
                           (uint)bVar29 * iVar21 | (uint)!bVar29 * *(int *)(args.ray + 0xfc);
                      iVar19 = *(int *)(args.hit + 0x44);
                      iVar20 = *(int *)(args.hit + 0x48);
                      iVar21 = *(int *)(args.hit + 0x4c);
                      bVar31 = (bool)((byte)(uVar33 >> 1) & 1);
                      bVar32 = (bool)((byte)(uVar33 >> 2) & 1);
                      bVar29 = SUB81(uVar33 >> 3,0);
                      *(uint *)(args.ray + 0x100) =
                           (uint)(bVar22 & 1) * *(int *)(args.hit + 0x40) |
                           (uint)!(bool)(bVar22 & 1) * *(uint *)(args.ray + 0x100);
                      *(uint *)(args.ray + 0x104) =
                           (uint)bVar31 * iVar19 | (uint)!bVar31 * *(int *)(args.ray + 0x104);
                      *(uint *)(args.ray + 0x108) =
                           (uint)bVar32 * iVar20 | (uint)!bVar32 * *(int *)(args.ray + 0x108);
                      *(uint *)(args.ray + 0x10c) =
                           (uint)bVar29 * iVar21 | (uint)!bVar29 * *(int *)(args.ray + 0x10c);
                      auVar58 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x50));
                      *(undefined1 (*) [16])(args.ray + 0x110) = auVar58;
                      auVar58 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x60));
                      *(undefined1 (*) [16])(args.ray + 0x120) = auVar58;
                      auVar58 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x70));
                      *(undefined1 (*) [16])(args.ray + 0x130) = auVar58;
                      auVar58 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x80));
                      *(undefined1 (*) [16])(args.ray + 0x140) = auVar58;
                      goto LAB_017dc5d9;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x80) = fVar210;
                }
              }
            }
          }
        }
      }
      goto LAB_017dc5d9;
    }
    auVar77 = vinsertps_avx(auVar164,auVar70,0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_hn(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }